

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx2::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [32];
  undefined1 (*pauVar6) [32];
  float *pfVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  Primitive PVar10;
  int iVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  long lVar23;
  long lVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [28];
  byte bVar86;
  bool bVar87;
  uint uVar88;
  ulong uVar89;
  ulong uVar90;
  ulong uVar91;
  Geometry *geometry;
  long lVar92;
  ulong uVar93;
  undefined4 uVar94;
  undefined8 uVar95;
  float fVar112;
  vint4 bi_2;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar111;
  float fVar113;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar100 [16];
  undefined1 auVar110 [32];
  undefined8 uVar117;
  vint4 bi_1;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar121 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [64];
  float fVar134;
  float fVar135;
  undefined1 auVar136 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar145 [32];
  undefined1 auVar139 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  vint4 ai_2;
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [64];
  vint4 ai;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  vint4 bi;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [64];
  vint4 ai_1;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  undefined4 uVar200;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [64];
  float fVar205;
  float fVar211;
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  float fVar212;
  float fVar217;
  float fVar218;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  RTCFilterFunctionNArguments args;
  undefined1 local_840 [32];
  undefined1 local_820 [16];
  undefined1 local_800 [32];
  undefined1 local_720 [16];
  ulong local_708;
  undefined1 local_700 [32];
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined1 (*local_638) [16];
  RTCFilterFunctionNArguments local_630;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  ulong local_5c0;
  undefined4 uStack_5b8;
  undefined4 uStack_5b4;
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [32];
  LinearSpace3fa *local_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined1 local_3b0 [16];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  int iStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined4 local_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  int local_200;
  int local_1fc;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_180 [4];
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar187 [16];
  
  PVar10 = prim[1];
  uVar93 = (ulong)(byte)PVar10;
  fVar135 = *(float *)(prim + uVar93 * 0x19 + 0x12);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar14 = vsubps_avx(auVar14,*(undefined1 (*) [16])(prim + uVar93 * 0x19 + 6));
  auVar96._0_4_ = fVar135 * auVar14._0_4_;
  auVar96._4_4_ = fVar135 * auVar14._4_4_;
  auVar96._8_4_ = fVar135 * auVar14._8_4_;
  auVar96._12_4_ = fVar135 * auVar14._12_4_;
  auVar160._0_4_ = fVar135 * auVar15._0_4_;
  auVar160._4_4_ = fVar135 * auVar15._4_4_;
  auVar160._8_4_ = fVar135 * auVar15._8_4_;
  auVar160._12_4_ = fVar135 * auVar15._12_4_;
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 4 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 5 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 6 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 0xb + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar10 * 0xc) + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar10 * 0xc + uVar93 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  uVar89 = (ulong)(uint)((int)(uVar93 * 9) * 2);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 + uVar93 + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  uVar89 = (ulong)(uint)((int)(uVar93 * 5) << 2);
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 + 6)));
  auVar136 = vcvtdq2ps_avx(auVar136);
  auVar213._4_4_ = auVar160._0_4_;
  auVar213._0_4_ = auVar160._0_4_;
  auVar213._8_4_ = auVar160._0_4_;
  auVar213._12_4_ = auVar160._0_4_;
  auVar119 = vshufps_avx(auVar160,auVar160,0x55);
  auVar97 = vshufps_avx(auVar160,auVar160,0xaa);
  fVar135 = auVar97._0_4_;
  auVar201._0_4_ = fVar135 * auVar16._0_4_;
  fVar134 = auVar97._4_4_;
  auVar201._4_4_ = fVar134 * auVar16._4_4_;
  fVar111 = auVar97._8_4_;
  auVar201._8_4_ = fVar111 * auVar16._8_4_;
  fVar112 = auVar97._12_4_;
  auVar201._12_4_ = fVar112 * auVar16._12_4_;
  auVar193._0_4_ = auVar19._0_4_ * fVar135;
  auVar193._4_4_ = auVar19._4_4_ * fVar134;
  auVar193._8_4_ = auVar19._8_4_ * fVar111;
  auVar193._12_4_ = auVar19._12_4_ * fVar112;
  auVar183._0_4_ = auVar136._0_4_ * fVar135;
  auVar183._4_4_ = auVar136._4_4_ * fVar134;
  auVar183._8_4_ = auVar136._8_4_ * fVar111;
  auVar183._12_4_ = auVar136._12_4_ * fVar112;
  auVar97 = vfmadd231ps_fma(auVar201,auVar119,auVar15);
  auVar120 = vfmadd231ps_fma(auVar193,auVar119,auVar18);
  auVar119 = vfmadd231ps_fma(auVar183,auVar98,auVar119);
  auVar148 = vfmadd231ps_fma(auVar97,auVar213,auVar14);
  auVar204 = ZEXT1664(auVar148);
  auVar120 = vfmadd231ps_fma(auVar120,auVar213,auVar17);
  auVar155 = vfmadd231ps_fma(auVar119,auVar99,auVar213);
  auVar214._4_4_ = auVar96._0_4_;
  auVar214._0_4_ = auVar96._0_4_;
  auVar214._8_4_ = auVar96._0_4_;
  auVar214._12_4_ = auVar96._0_4_;
  auVar119 = vshufps_avx(auVar96,auVar96,0x55);
  auVar97 = vshufps_avx(auVar96,auVar96,0xaa);
  fVar135 = auVar97._0_4_;
  auVar161._0_4_ = fVar135 * auVar16._0_4_;
  fVar134 = auVar97._4_4_;
  auVar161._4_4_ = fVar134 * auVar16._4_4_;
  fVar111 = auVar97._8_4_;
  auVar161._8_4_ = fVar111 * auVar16._8_4_;
  fVar112 = auVar97._12_4_;
  auVar161._12_4_ = fVar112 * auVar16._12_4_;
  auVar118._0_4_ = auVar19._0_4_ * fVar135;
  auVar118._4_4_ = auVar19._4_4_ * fVar134;
  auVar118._8_4_ = auVar19._8_4_ * fVar111;
  auVar118._12_4_ = auVar19._12_4_ * fVar112;
  auVar97._0_4_ = auVar136._0_4_ * fVar135;
  auVar97._4_4_ = auVar136._4_4_ * fVar134;
  auVar97._8_4_ = auVar136._8_4_ * fVar111;
  auVar97._12_4_ = auVar136._12_4_ * fVar112;
  auVar15 = vfmadd231ps_fma(auVar161,auVar119,auVar15);
  auVar16 = vfmadd231ps_fma(auVar118,auVar119,auVar18);
  auVar18 = vfmadd231ps_fma(auVar97,auVar119,auVar98);
  auVar19 = vfmadd231ps_fma(auVar15,auVar214,auVar14);
  auVar98 = vfmadd231ps_fma(auVar16,auVar214,auVar17);
  auVar136 = vfmadd231ps_fma(auVar18,auVar214,auVar99);
  local_290._8_4_ = 0x7fffffff;
  local_290._0_8_ = 0x7fffffff7fffffff;
  local_290._12_4_ = 0x7fffffff;
  auVar14 = vandps_avx(auVar148,local_290);
  auVar154._8_4_ = 0x219392ef;
  auVar154._0_8_ = 0x219392ef219392ef;
  auVar154._12_4_ = 0x219392ef;
  auVar14 = vcmpps_avx(auVar14,auVar154,1);
  auVar15 = vblendvps_avx(auVar148,auVar154,auVar14);
  auVar14 = vandps_avx(auVar120,local_290);
  auVar14 = vcmpps_avx(auVar14,auVar154,1);
  auVar16 = vblendvps_avx(auVar120,auVar154,auVar14);
  auVar14 = vandps_avx(auVar155,local_290);
  auVar14 = vcmpps_avx(auVar14,auVar154,1);
  auVar14 = vblendvps_avx(auVar155,auVar154,auVar14);
  auVar17 = vrcpps_avx(auVar15);
  auVar179._8_4_ = 0x3f800000;
  auVar179._0_8_ = 0x3f8000003f800000;
  auVar179._12_4_ = 0x3f800000;
  auVar15 = vfnmadd213ps_fma(auVar15,auVar17,auVar179);
  auVar17 = vfmadd132ps_fma(auVar15,auVar17,auVar17);
  auVar15 = vrcpps_avx(auVar16);
  auVar16 = vfnmadd213ps_fma(auVar16,auVar15,auVar179);
  auVar18 = vfmadd132ps_fma(auVar16,auVar15,auVar15);
  auVar15 = vrcpps_avx(auVar14);
  auVar14 = vfnmadd213ps_fma(auVar14,auVar15,auVar179);
  auVar99 = vfmadd132ps_fma(auVar14,auVar15,auVar15);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar93 * 7 + 6);
  auVar14 = vpmovsxwd_avx(auVar14);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar19);
  auVar155._0_4_ = auVar17._0_4_ * auVar14._0_4_;
  auVar155._4_4_ = auVar17._4_4_ * auVar14._4_4_;
  auVar155._8_4_ = auVar17._8_4_ * auVar14._8_4_;
  auVar155._12_4_ = auVar17._12_4_ * auVar14._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar93 * 9 + 6);
  auVar14 = vpmovsxwd_avx(auVar15);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar19);
  auVar162._0_4_ = auVar17._0_4_ * auVar14._0_4_;
  auVar162._4_4_ = auVar17._4_4_ * auVar14._4_4_;
  auVar162._8_4_ = auVar17._8_4_ * auVar14._8_4_;
  auVar162._12_4_ = auVar17._12_4_ * auVar14._12_4_;
  auVar120._1_3_ = 0;
  auVar120[0] = PVar10;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  auVar15 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar93 * -2 + 6);
  auVar14 = vpmovsxwd_avx(auVar17);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar98);
  auVar184._0_4_ = auVar14._0_4_ * auVar18._0_4_;
  auVar184._4_4_ = auVar14._4_4_ * auVar18._4_4_;
  auVar184._8_4_ = auVar14._8_4_ * auVar18._8_4_;
  auVar184._12_4_ = auVar14._12_4_ * auVar18._12_4_;
  auVar14 = vcvtdq2ps_avx(auVar15);
  auVar14 = vsubps_avx(auVar14,auVar98);
  auVar119._0_4_ = auVar18._0_4_ * auVar14._0_4_;
  auVar119._4_4_ = auVar18._4_4_ * auVar14._4_4_;
  auVar119._8_4_ = auVar18._8_4_ * auVar14._8_4_;
  auVar119._12_4_ = auVar18._12_4_ * auVar14._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar89 + uVar93 + 6);
  auVar14 = vpmovsxwd_avx(auVar18);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar136);
  auVar148._0_4_ = auVar99._0_4_ * auVar14._0_4_;
  auVar148._4_4_ = auVar99._4_4_ * auVar14._4_4_;
  auVar148._8_4_ = auVar99._8_4_ * auVar14._8_4_;
  auVar148._12_4_ = auVar99._12_4_ * auVar14._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar93 * 0x17 + 6);
  auVar14 = vpmovsxwd_avx(auVar19);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar136);
  auVar98._0_4_ = auVar99._0_4_ * auVar14._0_4_;
  auVar98._4_4_ = auVar99._4_4_ * auVar14._4_4_;
  auVar98._8_4_ = auVar99._8_4_ * auVar14._8_4_;
  auVar98._12_4_ = auVar99._12_4_ * auVar14._12_4_;
  auVar14 = vpminsd_avx(auVar155,auVar162);
  auVar15 = vpminsd_avx(auVar184,auVar119);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar15 = vpminsd_avx(auVar148,auVar98);
  uVar94 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar187._4_4_ = uVar94;
  auVar187._0_4_ = uVar94;
  auVar187._8_4_ = uVar94;
  auVar187._12_4_ = uVar94;
  auVar192 = ZEXT1664(auVar187);
  auVar15 = vmaxps_avx(auVar15,auVar187);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  local_2a0._0_4_ = auVar14._0_4_ * 0.99999964;
  local_2a0._4_4_ = auVar14._4_4_ * 0.99999964;
  local_2a0._8_4_ = auVar14._8_4_ * 0.99999964;
  local_2a0._12_4_ = auVar14._12_4_ * 0.99999964;
  auVar14 = vpmaxsd_avx(auVar155,auVar162);
  auVar15 = vpmaxsd_avx(auVar184,auVar119);
  auVar14 = vminps_avx(auVar14,auVar15);
  auVar15 = vpmaxsd_avx(auVar148,auVar98);
  uVar94 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar136._4_4_ = uVar94;
  auVar136._0_4_ = uVar94;
  auVar136._8_4_ = uVar94;
  auVar136._12_4_ = uVar94;
  auVar15 = vminps_avx(auVar15,auVar136);
  auVar14 = vminps_avx(auVar14,auVar15);
  auVar99._0_4_ = auVar14._0_4_ * 1.0000004;
  auVar99._4_4_ = auVar14._4_4_ * 1.0000004;
  auVar99._8_4_ = auVar14._8_4_ * 1.0000004;
  auVar99._12_4_ = auVar14._12_4_ * 1.0000004;
  auVar120[4] = PVar10;
  auVar120._5_3_ = 0;
  auVar120[8] = PVar10;
  auVar120._9_3_ = 0;
  auVar120[0xc] = PVar10;
  auVar120._13_3_ = 0;
  auVar15 = vpcmpgtd_avx(auVar120,_DAT_01f7fcf0);
  auVar14 = vcmpps_avx(local_2a0,auVar99,2);
  auVar14 = vandps_avx(auVar14,auVar15);
  uVar88 = vmovmskps_avx(auVar14);
  if (uVar88 == 0) {
    bVar87 = false;
  }
  else {
    uVar88 = uVar88 & 0xff;
    local_548 = pre->ray_space + k;
    local_540 = mm_lookupmask_ps._16_8_;
    uStack_538 = mm_lookupmask_ps._24_8_;
    uStack_530 = mm_lookupmask_ps._16_8_;
    uStack_528 = mm_lookupmask_ps._24_8_;
    local_638 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
    do {
      auVar131 = local_440;
      auVar203 = auVar204._0_32_;
      lVar23 = 0;
      uVar93 = (ulong)uVar88;
      for (uVar89 = uVar93; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      local_820._4_4_ = *(undefined4 *)(prim + 2);
      local_708 = (ulong)(uint)local_820._4_4_;
      local_600._4_4_ = *(undefined4 *)(prim + lVar23 * 4 + 6);
      local_5c0 = (ulong)(uint)local_600._4_4_;
      pGVar12 = (context->scene->geometries).items[local_708].ptr;
      uVar89 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                               pGVar12[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * local_5c0);
      p_Var13 = pGVar12[1].intersectionFilterN;
      lVar23 = *(long *)&pGVar12[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar23 + (long)p_Var13 * uVar89);
      local_650 = *(undefined8 *)*pauVar1;
      uStack_648 = *(undefined8 *)(*pauVar1 + 8);
      pauVar2 = (undefined1 (*) [16])(lVar23 + (uVar89 + 1) * (long)p_Var13);
      local_660 = *(undefined8 *)*pauVar2;
      uStack_658 = *(undefined8 *)(*pauVar2 + 8);
      pauVar3 = (undefined1 (*) [16])(lVar23 + (uVar89 + 2) * (long)p_Var13);
      local_670 = *(undefined8 *)*pauVar3;
      uStack_668 = *(undefined8 *)(*pauVar3 + 8);
      uVar93 = uVar93 - 1 & uVar93;
      pauVar4 = (undefined1 (*) [12])(lVar23 + (uVar89 + 3) * (long)p_Var13);
      local_5b0 = (float)*(undefined8 *)*pauVar4;
      fStack_5ac = (float)((ulong)*(undefined8 *)*pauVar4 >> 0x20);
      fStack_5a8 = (float)*(undefined8 *)(*pauVar4 + 8);
      fStack_5a4 = (float)((ulong)*(undefined8 *)(*pauVar4 + 8) >> 0x20);
      if (uVar93 != 0) {
        uVar90 = uVar93 - 1 & uVar93;
        for (uVar89 = uVar93; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
        }
        if (uVar90 != 0) {
          for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar11 = (int)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar17 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar15 = vsubps_avx(*pauVar1,auVar17);
      uVar94 = auVar15._0_4_;
      auVar156._4_4_ = uVar94;
      auVar156._0_4_ = uVar94;
      auVar156._8_4_ = uVar94;
      auVar156._12_4_ = uVar94;
      auVar14 = vshufps_avx(auVar15,auVar15,0x55);
      auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
      aVar8 = (local_548->vx).field_0;
      aVar9 = (local_548->vy).field_0;
      fVar135 = (local_548->vz).field_0.m128[0];
      fVar134 = *(float *)((long)&(local_548->vz).field_0 + 4);
      fVar111 = *(float *)((long)&(local_548->vz).field_0 + 8);
      fVar112 = *(float *)((long)&(local_548->vz).field_0 + 0xc);
      auVar171._0_4_ = fVar135 * auVar15._0_4_;
      auVar171._4_4_ = fVar134 * auVar15._4_4_;
      auVar171._8_4_ = fVar111 * auVar15._8_4_;
      auVar171._12_4_ = fVar112 * auVar15._12_4_;
      auVar14 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar9,auVar14);
      auVar19 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar8,auVar156);
      auVar14 = vblendps_avx(auVar19,*pauVar1,8);
      auVar16 = vsubps_avx(*pauVar2,auVar17);
      uVar94 = auVar16._0_4_;
      auVar172._4_4_ = uVar94;
      auVar172._0_4_ = uVar94;
      auVar172._8_4_ = uVar94;
      auVar172._12_4_ = uVar94;
      auVar15 = vshufps_avx(auVar16,auVar16,0x55);
      auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
      auVar194._0_4_ = fVar135 * auVar16._0_4_;
      auVar194._4_4_ = fVar134 * auVar16._4_4_;
      auVar194._8_4_ = fVar111 * auVar16._8_4_;
      auVar194._12_4_ = fVar112 * auVar16._12_4_;
      auVar15 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar9,auVar15);
      auVar99 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar8,auVar172);
      auVar15 = vblendps_avx(auVar99,*pauVar2,8);
      auVar18 = vsubps_avx(*pauVar3,auVar17);
      uVar94 = auVar18._0_4_;
      auVar180._4_4_ = uVar94;
      auVar180._0_4_ = uVar94;
      auVar180._8_4_ = uVar94;
      auVar180._12_4_ = uVar94;
      auVar16 = vshufps_avx(auVar18,auVar18,0x55);
      auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
      auVar202._0_4_ = fVar135 * auVar18._0_4_;
      auVar202._4_4_ = fVar134 * auVar18._4_4_;
      auVar202._8_4_ = fVar111 * auVar18._8_4_;
      auVar202._12_4_ = fVar112 * auVar18._12_4_;
      auVar16 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar9,auVar16);
      auVar98 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar8,auVar180);
      auVar16 = vblendps_avx(auVar98,*pauVar3,8);
      auVar81._12_4_ = fStack_5a4;
      auVar81._0_12_ = *pauVar4;
      auVar18 = vsubps_avx(auVar81,auVar17);
      uVar94 = auVar18._0_4_;
      auVar181._4_4_ = uVar94;
      auVar181._0_4_ = uVar94;
      auVar181._8_4_ = uVar94;
      auVar181._12_4_ = uVar94;
      auVar17 = vshufps_avx(auVar18,auVar18,0x55);
      auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
      auVar206._0_4_ = fVar135 * auVar18._0_4_;
      auVar206._4_4_ = fVar134 * auVar18._4_4_;
      auVar206._8_4_ = fVar111 * auVar18._8_4_;
      auVar206._12_4_ = fVar112 * auVar18._12_4_;
      auVar17 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar9,auVar17);
      auVar136 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar8,auVar181);
      auVar17 = vblendps_avx(auVar136,auVar81,8);
      auVar14 = vandps_avx(auVar14,local_290);
      auVar15 = vandps_avx(auVar15,local_290);
      auVar18 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vandps_avx(auVar16,local_290);
      auVar15 = vandps_avx(auVar17,local_290);
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(auVar18,auVar14);
      auVar15 = vmovshdup_avx(auVar14);
      auVar15 = vmaxss_avx(auVar15,auVar14);
      auVar14 = vshufpd_avx(auVar14,auVar14,1);
      auVar14 = vmaxss_avx(auVar14,auVar15);
      lVar23 = (long)iVar11 * 0x44;
      auVar15 = vmovshdup_avx(auVar19);
      uVar95 = auVar15._0_8_;
      local_500._8_8_ = uVar95;
      local_500._0_8_ = uVar95;
      local_500._16_8_ = uVar95;
      local_500._24_8_ = uVar95;
      auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x484);
      auVar15 = vmovshdup_avx(auVar99);
      uVar95 = auVar15._0_8_;
      auVar149._8_8_ = uVar95;
      auVar149._0_8_ = uVar95;
      auVar149._16_8_ = uVar95;
      auVar149._24_8_ = uVar95;
      auVar146 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x908);
      uVar200 = auVar98._0_4_;
      auVar143._4_4_ = uVar200;
      auVar143._0_4_ = uVar200;
      auVar143._8_4_ = uVar200;
      auVar143._12_4_ = uVar200;
      auVar143._16_4_ = uVar200;
      auVar143._20_4_ = uVar200;
      auVar143._24_4_ = uVar200;
      auVar143._28_4_ = uVar200;
      auVar15 = vmovshdup_avx(auVar98);
      uVar95 = auVar15._0_8_;
      auVar165._8_8_ = uVar95;
      auVar165._0_8_ = uVar95;
      auVar165._16_8_ = uVar95;
      auVar165._24_8_ = uVar95;
      fVar134 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar23 + 0xd8c);
      fVar111 = *(float *)(bezier_basis0 + lVar23 + 0xd90);
      fVar112 = *(float *)(bezier_basis0 + lVar23 + 0xd94);
      fVar113 = *(float *)(bezier_basis0 + lVar23 + 0xd98);
      fVar114 = *(float *)(bezier_basis0 + lVar23 + 0xd9c);
      fVar115 = *(float *)(bezier_basis0 + lVar23 + 0xda0);
      fVar116 = *(float *)(bezier_basis0 + lVar23 + 0xda4);
      auVar85 = *(undefined1 (*) [28])(bezier_basis0 + lVar23 + 0xd8c);
      local_6e0 = auVar136._0_4_;
      auVar15 = vmovshdup_avx(auVar136);
      uVar95 = auVar15._0_8_;
      auVar173._0_4_ = fVar134 * local_6e0;
      auVar173._4_4_ = fVar111 * local_6e0;
      auVar173._8_4_ = fVar112 * local_6e0;
      auVar173._12_4_ = fVar113 * local_6e0;
      auVar173._16_4_ = fVar114 * local_6e0;
      auVar173._20_4_ = fVar115 * local_6e0;
      auVar173._24_4_ = fVar116 * local_6e0;
      auVar173._28_4_ = 0;
      fVar212 = auVar15._0_4_;
      auVar101._0_4_ = fVar212 * fVar134;
      fVar217 = auVar15._4_4_;
      auVar101._4_4_ = fVar217 * fVar111;
      auVar101._8_4_ = fVar212 * fVar112;
      auVar101._12_4_ = fVar217 * fVar113;
      auVar101._16_4_ = fVar212 * fVar114;
      auVar101._20_4_ = fVar217 * fVar115;
      auVar101._24_4_ = fVar212 * fVar116;
      auVar101._28_4_ = 0;
      auVar15 = vfmadd231ps_fma(auVar173,auVar146,auVar143);
      auVar16 = vfmadd231ps_fma(auVar101,auVar146,auVar165);
      uVar94 = auVar99._0_4_;
      local_6c0._4_4_ = uVar94;
      local_6c0._0_4_ = uVar94;
      local_6c0._8_4_ = uVar94;
      local_6c0._12_4_ = uVar94;
      local_6c0._16_4_ = uVar94;
      local_6c0._20_4_ = uVar94;
      local_6c0._24_4_ = uVar94;
      local_6c0._28_4_ = uVar94;
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar109,local_6c0);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar109,auVar149);
      auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar23);
      uVar94 = auVar19._0_4_;
      local_6a0._4_4_ = uVar94;
      local_6a0._0_4_ = uVar94;
      local_6a0._8_4_ = uVar94;
      local_6a0._12_4_ = uVar94;
      local_6a0._16_4_ = uVar94;
      local_6a0._20_4_ = uVar94;
      local_6a0._24_4_ = uVar94;
      local_6a0._28_4_ = uVar94;
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar101,local_6a0);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar101,local_500);
      auVar173 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x908);
      local_320 = *(float *)(bezier_basis1 + lVar23 + 0xd8c);
      fStack_31c = *(float *)(bezier_basis1 + lVar23 + 0xd90);
      fStack_318 = *(float *)(bezier_basis1 + lVar23 + 0xd94);
      fStack_314 = *(float *)(bezier_basis1 + lVar23 + 0xd98);
      fStack_310 = *(float *)(bezier_basis1 + lVar23 + 0xd9c);
      fStack_30c = *(float *)(bezier_basis1 + lVar23 + 0xda0);
      fStack_308 = *(float *)(bezier_basis1 + lVar23 + 0xda4);
      iStack_304 = *(int *)(bezier_basis1 + lVar23 + 0xda8);
      auVar191._4_4_ = fStack_31c * local_6e0;
      auVar191._0_4_ = local_320 * local_6e0;
      auVar191._8_4_ = fStack_318 * local_6e0;
      auVar191._12_4_ = fStack_314 * local_6e0;
      auVar191._16_4_ = fStack_310 * local_6e0;
      auVar191._20_4_ = fStack_30c * local_6e0;
      auVar191._24_4_ = fStack_308 * local_6e0;
      auVar191._28_4_ = local_6e0;
      auVar17 = vfmadd231ps_fma(auVar191,auVar173,auVar143);
      auVar167._4_4_ = fVar217 * fStack_31c;
      auVar167._0_4_ = fVar212 * local_320;
      auVar167._8_4_ = fVar212 * fStack_318;
      auVar167._12_4_ = fVar217 * fStack_314;
      auVar167._16_4_ = fVar212 * fStack_310;
      auVar167._20_4_ = fVar217 * fStack_30c;
      auVar167._24_4_ = fVar212 * fStack_308;
      auVar167._28_4_ = uVar200;
      auVar18 = vfmadd231ps_fma(auVar167,auVar173,auVar165);
      auVar191 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x484);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar191,local_6c0);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar191,auVar149);
      auVar167 = *(undefined1 (*) [32])(bezier_basis1 + lVar23);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar167,local_6a0);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar167,local_500);
      auVar123 = ZEXT1632(auVar17);
      local_300 = ZEXT1632(auVar15);
      auVar20 = vsubps_avx(auVar123,local_300);
      local_2e0 = ZEXT1632(auVar18);
      auVar102 = ZEXT1632(auVar16);
      auVar129 = vsubps_avx(local_2e0,auVar102);
      auVar103._0_4_ = auVar16._0_4_ * auVar20._0_4_;
      auVar103._4_4_ = auVar16._4_4_ * auVar20._4_4_;
      auVar103._8_4_ = auVar16._8_4_ * auVar20._8_4_;
      auVar103._12_4_ = auVar16._12_4_ * auVar20._12_4_;
      auVar103._16_4_ = auVar20._16_4_ * 0.0;
      auVar103._20_4_ = auVar20._20_4_ * 0.0;
      auVar103._24_4_ = auVar20._24_4_ * 0.0;
      auVar103._28_4_ = 0;
      fVar205 = auVar129._0_4_;
      auVar124._0_4_ = fVar205 * auVar15._0_4_;
      fVar211 = auVar129._4_4_;
      auVar124._4_4_ = fVar211 * auVar15._4_4_;
      fVar218 = auVar129._8_4_;
      auVar124._8_4_ = fVar218 * auVar15._8_4_;
      fVar219 = auVar129._12_4_;
      auVar124._12_4_ = fVar219 * auVar15._12_4_;
      fVar220 = auVar129._16_4_;
      auVar124._16_4_ = fVar220 * 0.0;
      fVar221 = auVar129._20_4_;
      auVar124._20_4_ = fVar221 * 0.0;
      fVar222 = auVar129._24_4_;
      auVar124._24_4_ = fVar222 * 0.0;
      auVar124._28_4_ = 0;
      auVar103 = vsubps_avx(auVar103,auVar124);
      auVar15 = vpermilps_avx(*pauVar1,0xff);
      uVar117 = auVar15._0_8_;
      local_80._8_8_ = uVar117;
      local_80._0_8_ = uVar117;
      local_80._16_8_ = uVar117;
      local_80._24_8_ = uVar117;
      auVar16 = vpermilps_avx(*pauVar2,0xff);
      uVar117 = auVar16._0_8_;
      local_a0._8_8_ = uVar117;
      local_a0._0_8_ = uVar117;
      local_a0._16_8_ = uVar117;
      local_a0._24_8_ = uVar117;
      auVar16 = vpermilps_avx(*pauVar3,0xff);
      uVar117 = auVar16._0_8_;
      local_c0._8_8_ = uVar117;
      local_c0._0_8_ = uVar117;
      local_c0._16_8_ = uVar117;
      local_c0._24_8_ = uVar117;
      auVar82._12_4_ = fStack_5a4;
      auVar82._0_12_ = *pauVar4;
      auVar16 = vpermilps_avx(auVar82,0xff);
      local_e0 = auVar16._0_8_;
      fVar135 = auVar16._0_4_;
      auVar174._0_4_ = fVar134 * fVar135;
      fVar134 = auVar16._4_4_;
      auVar174._4_4_ = fVar111 * fVar134;
      auVar174._8_4_ = fVar112 * fVar135;
      auVar174._12_4_ = fVar113 * fVar134;
      auVar174._16_4_ = fVar114 * fVar135;
      auVar174._20_4_ = fVar115 * fVar134;
      auVar174._24_4_ = fVar116 * fVar135;
      auVar174._28_4_ = 0;
      auVar16 = vfmadd231ps_fma(auVar174,local_c0,auVar146);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_a0,auVar109);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar101,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar110._4_4_ = fStack_31c * fVar134;
      auVar110._0_4_ = local_320 * fVar135;
      auVar110._8_4_ = fStack_318 * fVar135;
      auVar110._12_4_ = fStack_314 * fVar134;
      auVar110._16_4_ = fStack_310 * fVar135;
      auVar110._20_4_ = fStack_30c * fVar134;
      auVar110._24_4_ = fStack_308 * fVar135;
      auVar110._28_4_ = auVar101._28_4_;
      auVar16 = vfmadd231ps_fma(auVar110,auVar173,local_c0);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar191,local_a0);
      auVar119 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar167,local_80);
      auVar198._4_4_ = fVar211 * fVar211;
      auVar198._0_4_ = fVar205 * fVar205;
      auVar198._8_4_ = fVar218 * fVar218;
      auVar198._12_4_ = fVar219 * fVar219;
      auVar198._16_4_ = fVar220 * fVar220;
      auVar198._20_4_ = fVar221 * fVar221;
      auVar198._24_4_ = fVar222 * fVar222;
      auVar198._28_4_ = auVar15._4_4_;
      auVar15 = vfmadd231ps_fma(auVar198,auVar20,auVar20);
      auVar110 = vmaxps_avx(ZEXT1632(auVar18),ZEXT1632(auVar119));
      auVar21._4_4_ = auVar110._4_4_ * auVar110._4_4_ * auVar15._4_4_;
      auVar21._0_4_ = auVar110._0_4_ * auVar110._0_4_ * auVar15._0_4_;
      auVar21._8_4_ = auVar110._8_4_ * auVar110._8_4_ * auVar15._8_4_;
      auVar21._12_4_ = auVar110._12_4_ * auVar110._12_4_ * auVar15._12_4_;
      auVar21._16_4_ = auVar110._16_4_ * auVar110._16_4_ * 0.0;
      auVar21._20_4_ = auVar110._20_4_ * auVar110._20_4_ * 0.0;
      auVar21._24_4_ = auVar110._24_4_ * auVar110._24_4_ * 0.0;
      auVar21._28_4_ = auVar110._28_4_;
      auVar22._4_4_ = auVar103._4_4_ * auVar103._4_4_;
      auVar22._0_4_ = auVar103._0_4_ * auVar103._0_4_;
      auVar22._8_4_ = auVar103._8_4_ * auVar103._8_4_;
      auVar22._12_4_ = auVar103._12_4_ * auVar103._12_4_;
      auVar22._16_4_ = auVar103._16_4_ * auVar103._16_4_;
      auVar22._20_4_ = auVar103._20_4_ * auVar103._20_4_;
      auVar22._24_4_ = auVar103._24_4_ * auVar103._24_4_;
      auVar22._28_4_ = auVar103._28_4_;
      auVar110 = vcmpps_avx(auVar22,auVar21,2);
      fVar135 = auVar14._0_4_ * 4.7683716e-07;
      auVar104._0_4_ = (float)iVar11;
      local_440._4_12_ = auVar98._4_12_;
      local_440._0_4_ = auVar104._0_4_;
      local_440._16_16_ = auVar131._16_16_;
      auVar104._4_4_ = auVar104._0_4_;
      auVar104._8_4_ = auVar104._0_4_;
      auVar104._12_4_ = auVar104._0_4_;
      auVar104._16_4_ = auVar104._0_4_;
      auVar104._20_4_ = auVar104._0_4_;
      auVar104._24_4_ = auVar104._0_4_;
      auVar104._28_4_ = auVar104._0_4_;
      auVar131 = vcmpps_avx(_DAT_01faff40,auVar104,1);
      auVar15 = vpermilps_avx(auVar19,0xaa);
      uVar117 = auVar15._0_8_;
      local_4a0._8_8_ = uVar117;
      local_4a0._0_8_ = uVar117;
      local_4a0._16_8_ = uVar117;
      local_4a0._24_8_ = uVar117;
      auVar16 = vpermilps_avx(auVar99,0xaa);
      uVar117 = auVar16._0_8_;
      local_480._8_8_ = uVar117;
      local_480._0_8_ = uVar117;
      local_480._16_8_ = uVar117;
      local_480._24_8_ = uVar117;
      auVar14 = vshufps_avx(auVar98,auVar98,0xaa);
      uVar117 = auVar14._0_8_;
      local_280._8_8_ = uVar117;
      local_280._0_8_ = uVar117;
      local_280._16_8_ = uVar117;
      local_280._24_8_ = uVar117;
      auVar14 = vshufps_avx(auVar136,auVar136,0xaa);
      uVar117 = auVar14._0_8_;
      register0x00001508 = uVar117;
      local_5a0 = uVar117;
      register0x00001510 = uVar117;
      register0x00001518 = uVar117;
      auVar103 = auVar131 & auVar110;
      local_520 = *(undefined4 *)(ray + k * 4 + 0x30);
      uStack_51c = 0;
      uStack_518 = 0;
      uStack_514 = 0;
      fStack_6dc = local_6e0;
      fStack_6d8 = local_6e0;
      fStack_6d4 = local_6e0;
      fStack_6d0 = local_6e0;
      fStack_6cc = local_6e0;
      fStack_6c8 = local_6e0;
      fStack_6c4 = local_6e0;
      if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar103 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar103 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar103 >> 0x7f,0) == '\0') &&
            (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar103 >> 0xbf,0) == '\0') &&
          (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar103[0x1f]) {
        auVar204 = ZEXT3264(auVar203);
LAB_01644cea:
        auVar182 = ZEXT3264(CONCAT428(local_6e0,
                                      CONCAT424(local_6e0,
                                                CONCAT420(local_6e0,
                                                          CONCAT416(local_6e0,
                                                                    CONCAT412(local_6e0,
                                                                              CONCAT48(local_6e0,
                                                                                       CONCAT44(
                                                  local_6e0,local_6e0))))))));
        auVar178 = ZEXT3264(CONCAT428(fVar217,CONCAT424(fVar212,CONCAT420(fVar217,CONCAT416(fVar212,
                                                  CONCAT412(fVar217,CONCAT48(fVar212,uVar95)))))));
LAB_01644d05:
        auVar210 = ZEXT3264(_local_5a0);
        auVar186 = ZEXT3264(local_6c0);
        bVar87 = false;
        auVar153 = ZEXT3264(local_6a0);
      }
      else {
        _local_340 = vandps_avx(auVar110,auVar131);
        fVar205 = auVar14._0_4_;
        fVar211 = auVar14._4_4_;
        auVar131._4_4_ = fVar211 * fStack_31c;
        auVar131._0_4_ = fVar205 * local_320;
        auVar131._8_4_ = fVar205 * fStack_318;
        auVar131._12_4_ = fVar211 * fStack_314;
        auVar131._16_4_ = fVar205 * fStack_310;
        auVar131._20_4_ = fVar211 * fStack_30c;
        auVar131._24_4_ = fVar205 * fStack_308;
        auVar131._28_4_ = local_340._28_4_;
        auVar14 = vfmadd213ps_fma(auVar173,local_280,auVar131);
        auVar14 = vfmadd213ps_fma(auVar191,local_480,ZEXT1632(auVar14));
        auVar14 = vfmadd213ps_fma(auVar167,local_4a0,ZEXT1632(auVar14));
        local_4e0._0_4_ = auVar85._0_4_;
        local_4e0._4_4_ = auVar85._4_4_;
        fStack_4d8 = auVar85._8_4_;
        fStack_4d4 = auVar85._12_4_;
        fStack_4d0 = auVar85._16_4_;
        fStack_4cc = auVar85._20_4_;
        fStack_4c8 = auVar85._24_4_;
        auVar105._0_4_ = fVar205 * (float)local_4e0._0_4_;
        auVar105._4_4_ = fVar211 * (float)local_4e0._4_4_;
        auVar105._8_4_ = fVar205 * fStack_4d8;
        auVar105._12_4_ = fVar211 * fStack_4d4;
        auVar105._16_4_ = fVar205 * fStack_4d0;
        auVar105._20_4_ = fVar211 * fStack_4cc;
        auVar105._24_4_ = fVar205 * fStack_4c8;
        auVar105._28_4_ = 0;
        auVar19 = vfmadd213ps_fma(auVar146,local_280,auVar105);
        auVar19 = vfmadd213ps_fma(auVar109,local_480,ZEXT1632(auVar19));
        auVar131 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1210);
        auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1694);
        auVar146 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1b18);
        fVar134 = *(float *)(bezier_basis0 + lVar23 + 0x1f9c);
        fVar111 = *(float *)(bezier_basis0 + lVar23 + 0x1fa0);
        fVar112 = *(float *)(bezier_basis0 + lVar23 + 0x1fa4);
        fVar113 = *(float *)(bezier_basis0 + lVar23 + 0x1fa8);
        fVar114 = *(float *)(bezier_basis0 + lVar23 + 0x1fac);
        fVar115 = *(float *)(bezier_basis0 + lVar23 + 0x1fb0);
        fVar116 = *(float *)(bezier_basis0 + lVar23 + 0x1fb4);
        auVar166._0_4_ = fVar134 * local_6e0;
        auVar166._4_4_ = fVar111 * local_6e0;
        auVar166._8_4_ = fVar112 * local_6e0;
        auVar166._12_4_ = fVar113 * local_6e0;
        auVar166._16_4_ = fVar114 * local_6e0;
        auVar166._20_4_ = fVar115 * local_6e0;
        auVar166._24_4_ = fVar116 * local_6e0;
        auVar166._28_4_ = 0;
        auVar25._4_4_ = fVar217 * fVar111;
        auVar25._0_4_ = fVar212 * fVar134;
        auVar25._8_4_ = fVar212 * fVar112;
        auVar25._12_4_ = fVar217 * fVar113;
        auVar25._16_4_ = fVar212 * fVar114;
        auVar25._20_4_ = fVar217 * fVar115;
        auVar25._24_4_ = fVar212 * fVar116;
        auVar25._28_4_ = auVar16._4_4_;
        auVar195._0_4_ = fVar205 * fVar134;
        auVar195._4_4_ = fVar211 * fVar111;
        auVar195._8_4_ = fVar205 * fVar112;
        auVar195._12_4_ = fVar211 * fVar113;
        auVar195._16_4_ = fVar205 * fVar114;
        auVar195._20_4_ = fVar211 * fVar115;
        auVar195._24_4_ = fVar205 * fVar116;
        auVar195._28_4_ = 0;
        auVar16 = vfmadd231ps_fma(auVar166,auVar146,auVar143);
        auVar99 = vfmadd231ps_fma(auVar25,auVar146,auVar165);
        auVar98 = vfmadd231ps_fma(auVar195,local_280,auVar146);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar109,local_6c0);
        auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar109,auVar149);
        auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar109,local_480);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar131,local_6a0);
        auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar131,local_500);
        auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),local_4a0,auVar131);
        fVar134 = *(float *)(bezier_basis1 + lVar23 + 0x1f9c);
        fVar111 = *(float *)(bezier_basis1 + lVar23 + 0x1fa0);
        fVar112 = *(float *)(bezier_basis1 + lVar23 + 0x1fa4);
        fVar113 = *(float *)(bezier_basis1 + lVar23 + 0x1fa8);
        fVar114 = *(float *)(bezier_basis1 + lVar23 + 0x1fac);
        fVar115 = *(float *)(bezier_basis1 + lVar23 + 0x1fb0);
        fVar116 = *(float *)(bezier_basis1 + lVar23 + 0x1fb4);
        auVar109._4_4_ = fVar111 * local_6e0;
        auVar109._0_4_ = fVar134 * local_6e0;
        auVar109._8_4_ = fVar112 * local_6e0;
        auVar109._12_4_ = fVar113 * local_6e0;
        auVar109._16_4_ = fVar114 * local_6e0;
        auVar109._20_4_ = fVar115 * local_6e0;
        auVar109._24_4_ = fVar116 * local_6e0;
        auVar109._28_4_ = auVar131._28_4_;
        auVar146._4_4_ = fVar217 * fVar111;
        auVar146._0_4_ = fVar212 * fVar134;
        auVar146._8_4_ = fVar212 * fVar112;
        auVar146._12_4_ = fVar217 * fVar113;
        auVar146._16_4_ = fVar212 * fVar114;
        auVar146._20_4_ = fVar217 * fVar115;
        auVar146._24_4_ = fVar212 * fVar116;
        auVar146._28_4_ = fVar211;
        auVar26._4_4_ = fVar211 * fVar111;
        auVar26._0_4_ = fVar205 * fVar134;
        auVar26._8_4_ = fVar205 * fVar112;
        auVar26._12_4_ = fVar211 * fVar113;
        auVar26._16_4_ = fVar205 * fVar114;
        auVar26._20_4_ = fVar211 * fVar115;
        auVar26._24_4_ = fVar205 * fVar116;
        auVar26._28_4_ = auVar15._4_4_;
        auVar131 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1b18);
        auVar15 = vfmadd231ps_fma(auVar109,auVar131,auVar143);
        auVar136 = vfmadd231ps_fma(auVar146,auVar131,auVar165);
        auVar97 = vfmadd231ps_fma(auVar26,auVar131,local_280);
        auVar131 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1694);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar131,local_6c0);
        auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar131,auVar149);
        auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar131,local_480);
        auVar131 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1210);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar131,local_6a0);
        auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar131,local_500);
        auVar125._8_4_ = 0x7fffffff;
        auVar125._0_8_ = 0x7fffffff7fffffff;
        auVar125._12_4_ = 0x7fffffff;
        auVar125._16_4_ = 0x7fffffff;
        auVar125._20_4_ = 0x7fffffff;
        auVar125._24_4_ = 0x7fffffff;
        auVar125._28_4_ = 0x7fffffff;
        auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),local_4a0,auVar131);
        auVar131 = vandps_avx(ZEXT1632(auVar16),auVar125);
        auVar109 = vandps_avx(ZEXT1632(auVar99),auVar125);
        auVar109 = vmaxps_avx(auVar131,auVar109);
        auVar131 = vandps_avx(ZEXT1632(auVar98),auVar125);
        auVar131 = vmaxps_avx(auVar109,auVar131);
        auVar144._4_4_ = fVar135;
        auVar144._0_4_ = fVar135;
        auVar144._8_4_ = fVar135;
        auVar144._12_4_ = fVar135;
        auVar144._16_4_ = fVar135;
        auVar144._20_4_ = fVar135;
        auVar144._24_4_ = fVar135;
        auVar144._28_4_ = fVar135;
        auVar131 = vcmpps_avx(auVar131,auVar144,1);
        auVar146 = vblendvps_avx(ZEXT1632(auVar16),auVar20,auVar131);
        auVar173 = vblendvps_avx(ZEXT1632(auVar99),auVar129,auVar131);
        auVar131 = vandps_avx(ZEXT1632(auVar15),auVar125);
        auVar109 = vandps_avx(ZEXT1632(auVar136),auVar125);
        auVar191 = vmaxps_avx(auVar131,auVar109);
        auVar131 = vandps_avx(ZEXT1632(auVar97),auVar125);
        auVar131 = vmaxps_avx(auVar191,auVar131);
        auVar167 = vcmpps_avx(auVar131,auVar144,1);
        auVar131 = vblendvps_avx(ZEXT1632(auVar15),auVar20,auVar167);
        auVar191 = vblendvps_avx(ZEXT1632(auVar136),auVar129,auVar167);
        auVar15 = vfmadd213ps_fma(auVar101,local_4a0,ZEXT1632(auVar19));
        auVar16 = vfmadd213ps_fma(auVar146,auVar146,ZEXT832(0) << 0x20);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar173,auVar173);
        auVar101 = vrsqrtps_avx(ZEXT1632(auVar16));
        fVar134 = auVar101._0_4_;
        fVar111 = auVar101._4_4_;
        fVar112 = auVar101._8_4_;
        fVar113 = auVar101._12_4_;
        fVar114 = auVar101._16_4_;
        fVar115 = auVar101._20_4_;
        fVar116 = auVar101._24_4_;
        auVar20._4_4_ = fVar111 * fVar111 * fVar111 * auVar16._4_4_ * -0.5;
        auVar20._0_4_ = fVar134 * fVar134 * fVar134 * auVar16._0_4_ * -0.5;
        auVar20._8_4_ = fVar112 * fVar112 * fVar112 * auVar16._8_4_ * -0.5;
        auVar20._12_4_ = fVar113 * fVar113 * fVar113 * auVar16._12_4_ * -0.5;
        auVar20._16_4_ = fVar114 * fVar114 * fVar114 * -0.0;
        auVar20._20_4_ = fVar115 * fVar115 * fVar115 * -0.0;
        auVar20._24_4_ = fVar116 * fVar116 * fVar116 * -0.0;
        auVar20._28_4_ = auVar109._28_4_;
        auVar215._8_4_ = 0x3fc00000;
        auVar215._0_8_ = 0x3fc000003fc00000;
        auVar215._12_4_ = 0x3fc00000;
        auVar215._16_4_ = 0x3fc00000;
        auVar215._20_4_ = 0x3fc00000;
        auVar215._24_4_ = 0x3fc00000;
        auVar215._28_4_ = 0x3fc00000;
        auVar16 = vfmadd231ps_fma(auVar20,auVar215,auVar101);
        fVar134 = auVar16._0_4_;
        fVar111 = auVar16._4_4_;
        auVar27._4_4_ = fVar111 * auVar173._4_4_;
        auVar27._0_4_ = fVar134 * auVar173._0_4_;
        fVar112 = auVar16._8_4_;
        auVar27._8_4_ = fVar112 * auVar173._8_4_;
        fVar113 = auVar16._12_4_;
        auVar27._12_4_ = fVar113 * auVar173._12_4_;
        auVar27._16_4_ = auVar173._16_4_ * 0.0;
        auVar27._20_4_ = auVar173._20_4_ * 0.0;
        auVar27._24_4_ = auVar173._24_4_ * 0.0;
        auVar27._28_4_ = 0;
        auVar28._4_4_ = fVar111 * -auVar146._4_4_;
        auVar28._0_4_ = fVar134 * -auVar146._0_4_;
        auVar28._8_4_ = fVar112 * -auVar146._8_4_;
        auVar28._12_4_ = fVar113 * -auVar146._12_4_;
        auVar28._16_4_ = -auVar146._16_4_ * 0.0;
        auVar28._20_4_ = -auVar146._20_4_ * 0.0;
        auVar28._24_4_ = -auVar146._24_4_ * 0.0;
        auVar28._28_4_ = auVar101._28_4_;
        auVar16 = vfmadd213ps_fma(auVar131,auVar131,ZEXT832(0) << 0x20);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar191,auVar191);
        auVar109 = vrsqrtps_avx(ZEXT1632(auVar16));
        auVar29._28_4_ = auVar167._28_4_;
        auVar29._0_28_ =
             ZEXT1628(CONCAT412(fVar113 * 0.0,
                                CONCAT48(fVar112 * 0.0,CONCAT44(fVar111 * 0.0,fVar134 * 0.0))));
        fVar134 = auVar109._0_4_;
        fVar111 = auVar109._4_4_;
        fVar112 = auVar109._8_4_;
        fVar113 = auVar109._12_4_;
        fVar114 = auVar109._16_4_;
        fVar115 = auVar109._20_4_;
        fVar116 = auVar109._24_4_;
        auVar30._4_4_ = fVar111 * fVar111 * fVar111 * auVar16._4_4_ * -0.5;
        auVar30._0_4_ = fVar134 * fVar134 * fVar134 * auVar16._0_4_ * -0.5;
        auVar30._8_4_ = fVar112 * fVar112 * fVar112 * auVar16._8_4_ * -0.5;
        auVar30._12_4_ = fVar113 * fVar113 * fVar113 * auVar16._12_4_ * -0.5;
        auVar30._16_4_ = fVar114 * fVar114 * fVar114 * -0.0;
        auVar30._20_4_ = fVar115 * fVar115 * fVar115 * -0.0;
        auVar30._24_4_ = fVar116 * fVar116 * fVar116 * -0.0;
        auVar30._28_4_ = 0;
        auVar16 = vfmadd231ps_fma(auVar30,auVar215,auVar109);
        fVar134 = auVar16._0_4_;
        auVar196._0_4_ = auVar191._0_4_ * fVar134;
        fVar111 = auVar16._4_4_;
        auVar196._4_4_ = auVar191._4_4_ * fVar111;
        fVar112 = auVar16._8_4_;
        auVar196._8_4_ = auVar191._8_4_ * fVar112;
        fVar113 = auVar16._12_4_;
        auVar196._12_4_ = auVar191._12_4_ * fVar113;
        auVar196._16_4_ = auVar191._16_4_ * 0.0;
        auVar196._20_4_ = auVar191._20_4_ * 0.0;
        auVar196._24_4_ = auVar191._24_4_ * 0.0;
        auVar196._28_4_ = 0;
        auVar31._4_4_ = -auVar131._4_4_ * fVar111;
        auVar31._0_4_ = -auVar131._0_4_ * fVar134;
        auVar31._8_4_ = -auVar131._8_4_ * fVar112;
        auVar31._12_4_ = -auVar131._12_4_ * fVar113;
        auVar31._16_4_ = -auVar131._16_4_ * 0.0;
        auVar31._20_4_ = -auVar131._20_4_ * 0.0;
        auVar31._24_4_ = -auVar131._24_4_ * 0.0;
        auVar31._28_4_ = auVar191._28_4_;
        auVar32._28_4_ = auVar109._28_4_;
        auVar32._0_28_ =
             ZEXT1628(CONCAT412(fVar113 * 0.0,
                                CONCAT48(fVar112 * 0.0,CONCAT44(fVar111 * 0.0,fVar134 * 0.0))));
        auVar16 = vfmadd213ps_fma(auVar27,ZEXT1632(auVar18),local_300);
        auVar131 = ZEXT1632(auVar18);
        auVar19 = vfmadd213ps_fma(auVar28,auVar131,auVar102);
        auVar99 = vfmadd213ps_fma(auVar29,auVar131,ZEXT1632(auVar15));
        auVar97 = vfnmadd213ps_fma(auVar27,auVar131,local_300);
        auVar98 = vfmadd213ps_fma(auVar196,ZEXT1632(auVar119),auVar123);
        auVar120 = vfnmadd213ps_fma(auVar28,auVar131,auVar102);
        auVar131 = ZEXT1632(auVar119);
        auVar136 = vfmadd213ps_fma(auVar31,auVar131,local_2e0);
        auVar174 = ZEXT1632(auVar18);
        auVar96 = vfnmadd231ps_fma(ZEXT1632(auVar15),auVar174,auVar29);
        auVar15 = vfmadd213ps_fma(auVar32,auVar131,ZEXT1632(auVar14));
        auVar148 = vfnmadd213ps_fma(auVar196,auVar131,auVar123);
        auVar155 = vfnmadd213ps_fma(auVar31,auVar131,local_2e0);
        auVar118 = vfnmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar119),auVar32);
        auVar131 = vsubps_avx(ZEXT1632(auVar136),ZEXT1632(auVar120));
        auVar109 = vsubps_avx(ZEXT1632(auVar15),ZEXT1632(auVar96));
        auVar102._4_4_ = auVar96._4_4_ * auVar131._4_4_;
        auVar102._0_4_ = auVar96._0_4_ * auVar131._0_4_;
        auVar102._8_4_ = auVar96._8_4_ * auVar131._8_4_;
        auVar102._12_4_ = auVar96._12_4_ * auVar131._12_4_;
        auVar102._16_4_ = auVar131._16_4_ * 0.0;
        auVar102._20_4_ = auVar131._20_4_ * 0.0;
        auVar102._24_4_ = auVar131._24_4_ * 0.0;
        auVar102._28_4_ = 0;
        auVar18 = vfmsub231ps_fma(auVar102,ZEXT1632(auVar120),auVar109);
        auVar123._4_4_ = auVar109._4_4_ * auVar97._4_4_;
        auVar123._0_4_ = auVar109._0_4_ * auVar97._0_4_;
        auVar123._8_4_ = auVar109._8_4_ * auVar97._8_4_;
        auVar123._12_4_ = auVar109._12_4_ * auVar97._12_4_;
        auVar123._16_4_ = auVar109._16_4_ * 0.0;
        auVar123._20_4_ = auVar109._20_4_ * 0.0;
        auVar123._24_4_ = auVar109._24_4_ * 0.0;
        auVar123._28_4_ = auVar109._28_4_;
        auVar109 = vsubps_avx(ZEXT1632(auVar98),ZEXT1632(auVar97));
        auVar14 = vfmsub231ps_fma(auVar123,ZEXT1632(auVar96),auVar109);
        auVar33._4_4_ = auVar120._4_4_ * auVar109._4_4_;
        auVar33._0_4_ = auVar120._0_4_ * auVar109._0_4_;
        auVar33._8_4_ = auVar120._8_4_ * auVar109._8_4_;
        auVar33._12_4_ = auVar120._12_4_ * auVar109._12_4_;
        auVar33._16_4_ = auVar109._16_4_ * 0.0;
        auVar33._20_4_ = auVar109._20_4_ * 0.0;
        auVar33._24_4_ = auVar109._24_4_ * 0.0;
        auVar33._28_4_ = auVar109._28_4_;
        auVar167 = ZEXT1632(auVar97);
        auVar97 = vfmsub231ps_fma(auVar33,auVar167,auVar131);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar97),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
        auVar103 = vcmpps_avx(ZEXT1632(auVar14),ZEXT832(0) << 0x20,2);
        auVar131 = vblendvps_avx(ZEXT1632(auVar148),ZEXT1632(auVar16),auVar103);
        auVar109 = vblendvps_avx(ZEXT1632(auVar155),ZEXT1632(auVar19),auVar103);
        auVar146 = vblendvps_avx(ZEXT1632(auVar118),ZEXT1632(auVar99),auVar103);
        auVar101 = vblendvps_avx(auVar167,ZEXT1632(auVar98),auVar103);
        auVar173 = vblendvps_avx(ZEXT1632(auVar120),ZEXT1632(auVar136),auVar103);
        auVar191 = vblendvps_avx(ZEXT1632(auVar96),ZEXT1632(auVar15),auVar103);
        auVar167 = vblendvps_avx(ZEXT1632(auVar98),auVar167,auVar103);
        auVar110 = vblendvps_avx(ZEXT1632(auVar136),ZEXT1632(auVar120),auVar103);
        auVar14 = vpackssdw_avx(local_340._0_16_,local_340._16_16_);
        auVar20 = vblendvps_avx(ZEXT1632(auVar15),ZEXT1632(auVar96),auVar103);
        auVar198 = vsubps_avx(auVar167,auVar131);
        auVar21 = vsubps_avx(auVar110,auVar109);
        auVar22 = vsubps_avx(auVar20,auVar146);
        auVar102 = vsubps_avx(auVar131,auVar101);
        auVar123 = vsubps_avx(auVar109,auVar173);
        auVar124 = vsubps_avx(auVar146,auVar191);
        auVar34._4_4_ = auVar22._4_4_ * auVar131._4_4_;
        auVar34._0_4_ = auVar22._0_4_ * auVar131._0_4_;
        auVar34._8_4_ = auVar22._8_4_ * auVar131._8_4_;
        auVar34._12_4_ = auVar22._12_4_ * auVar131._12_4_;
        auVar34._16_4_ = auVar22._16_4_ * auVar131._16_4_;
        auVar34._20_4_ = auVar22._20_4_ * auVar131._20_4_;
        auVar34._24_4_ = auVar22._24_4_ * auVar131._24_4_;
        auVar34._28_4_ = auVar20._28_4_;
        auVar15 = vfmsub231ps_fma(auVar34,auVar146,auVar198);
        auVar35._4_4_ = auVar198._4_4_ * auVar109._4_4_;
        auVar35._0_4_ = auVar198._0_4_ * auVar109._0_4_;
        auVar35._8_4_ = auVar198._8_4_ * auVar109._8_4_;
        auVar35._12_4_ = auVar198._12_4_ * auVar109._12_4_;
        auVar35._16_4_ = auVar198._16_4_ * auVar109._16_4_;
        auVar35._20_4_ = auVar198._20_4_ * auVar109._20_4_;
        auVar35._24_4_ = auVar198._24_4_ * auVar109._24_4_;
        auVar35._28_4_ = auVar167._28_4_;
        auVar16 = vfmsub231ps_fma(auVar35,auVar131,auVar21);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
        auVar106._0_4_ = auVar21._0_4_ * auVar146._0_4_;
        auVar106._4_4_ = auVar21._4_4_ * auVar146._4_4_;
        auVar106._8_4_ = auVar21._8_4_ * auVar146._8_4_;
        auVar106._12_4_ = auVar21._12_4_ * auVar146._12_4_;
        auVar106._16_4_ = auVar21._16_4_ * auVar146._16_4_;
        auVar106._20_4_ = auVar21._20_4_ * auVar146._20_4_;
        auVar106._24_4_ = auVar21._24_4_ * auVar146._24_4_;
        auVar106._28_4_ = 0;
        auVar16 = vfmsub231ps_fma(auVar106,auVar109,auVar22);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
        auVar107._0_4_ = auVar124._0_4_ * auVar101._0_4_;
        auVar107._4_4_ = auVar124._4_4_ * auVar101._4_4_;
        auVar107._8_4_ = auVar124._8_4_ * auVar101._8_4_;
        auVar107._12_4_ = auVar124._12_4_ * auVar101._12_4_;
        auVar107._16_4_ = auVar124._16_4_ * auVar101._16_4_;
        auVar107._20_4_ = auVar124._20_4_ * auVar101._20_4_;
        auVar107._24_4_ = auVar124._24_4_ * auVar101._24_4_;
        auVar107._28_4_ = 0;
        auVar15 = vfmsub231ps_fma(auVar107,auVar102,auVar191);
        auVar36._4_4_ = auVar123._4_4_ * auVar191._4_4_;
        auVar36._0_4_ = auVar123._0_4_ * auVar191._0_4_;
        auVar36._8_4_ = auVar123._8_4_ * auVar191._8_4_;
        auVar36._12_4_ = auVar123._12_4_ * auVar191._12_4_;
        auVar36._16_4_ = auVar123._16_4_ * auVar191._16_4_;
        auVar36._20_4_ = auVar123._20_4_ * auVar191._20_4_;
        auVar36._24_4_ = auVar123._24_4_ * auVar191._24_4_;
        auVar36._28_4_ = auVar191._28_4_;
        auVar18 = vfmsub231ps_fma(auVar36,auVar173,auVar124);
        auVar37._4_4_ = auVar102._4_4_ * auVar173._4_4_;
        auVar37._0_4_ = auVar102._0_4_ * auVar173._0_4_;
        auVar37._8_4_ = auVar102._8_4_ * auVar173._8_4_;
        auVar37._12_4_ = auVar102._12_4_ * auVar173._12_4_;
        auVar37._16_4_ = auVar102._16_4_ * auVar173._16_4_;
        auVar37._20_4_ = auVar102._20_4_ * auVar173._20_4_;
        auVar37._24_4_ = auVar102._24_4_ * auVar173._24_4_;
        auVar37._28_4_ = auVar110._28_4_;
        auVar19 = vfmsub231ps_fma(auVar37,auVar123,auVar101);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
        auVar101 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar18));
        auVar101 = vcmpps_avx(auVar101,ZEXT832(0) << 0x20,2);
        auVar15 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
        auVar14 = vpand_avx(auVar15,auVar14);
        auVar101 = vpmovsxwd_avx2(auVar14);
        if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar101 >> 0x7f,0) == '\0') &&
              (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar101 >> 0xbf,0) == '\0') &&
            (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar101[0x1f]) {
LAB_0164618b:
          auVar178 = ZEXT3264(CONCAT824(uStack_528,
                                        CONCAT816(uStack_530,CONCAT88(uStack_538,local_540))));
          auVar204 = ZEXT3264(auVar203);
        }
        else {
          auVar38._4_4_ = auVar21._4_4_ * auVar124._4_4_;
          auVar38._0_4_ = auVar21._0_4_ * auVar124._0_4_;
          auVar38._8_4_ = auVar21._8_4_ * auVar124._8_4_;
          auVar38._12_4_ = auVar21._12_4_ * auVar124._12_4_;
          auVar38._16_4_ = auVar21._16_4_ * auVar124._16_4_;
          auVar38._20_4_ = auVar21._20_4_ * auVar124._20_4_;
          auVar38._24_4_ = auVar21._24_4_ * auVar124._24_4_;
          auVar38._28_4_ = auVar101._28_4_;
          auVar98 = vfmsub231ps_fma(auVar38,auVar123,auVar22);
          auVar126._0_4_ = auVar22._0_4_ * auVar102._0_4_;
          auVar126._4_4_ = auVar22._4_4_ * auVar102._4_4_;
          auVar126._8_4_ = auVar22._8_4_ * auVar102._8_4_;
          auVar126._12_4_ = auVar22._12_4_ * auVar102._12_4_;
          auVar126._16_4_ = auVar22._16_4_ * auVar102._16_4_;
          auVar126._20_4_ = auVar22._20_4_ * auVar102._20_4_;
          auVar126._24_4_ = auVar22._24_4_ * auVar102._24_4_;
          auVar126._28_4_ = 0;
          auVar99 = vfmsub231ps_fma(auVar126,auVar198,auVar124);
          auVar39._4_4_ = auVar198._4_4_ * auVar123._4_4_;
          auVar39._0_4_ = auVar198._0_4_ * auVar123._0_4_;
          auVar39._8_4_ = auVar198._8_4_ * auVar123._8_4_;
          auVar39._12_4_ = auVar198._12_4_ * auVar123._12_4_;
          auVar39._16_4_ = auVar198._16_4_ * auVar123._16_4_;
          auVar39._20_4_ = auVar198._20_4_ * auVar123._20_4_;
          auVar39._24_4_ = auVar198._24_4_ * auVar123._24_4_;
          auVar39._28_4_ = auVar173._28_4_;
          auVar136 = vfmsub231ps_fma(auVar39,auVar102,auVar21);
          auVar15 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar99),ZEXT1632(auVar136));
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar98),_DAT_01faff00);
          auVar101 = vrcpps_avx(ZEXT1632(auVar19));
          auVar197._8_4_ = 0x3f800000;
          auVar197._0_8_ = 0x3f8000003f800000;
          auVar197._12_4_ = 0x3f800000;
          auVar197._16_4_ = 0x3f800000;
          auVar197._20_4_ = 0x3f800000;
          auVar197._24_4_ = 0x3f800000;
          auVar197._28_4_ = 0x3f800000;
          auVar15 = vfnmadd213ps_fma(auVar101,ZEXT1632(auVar19),auVar197);
          auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar101,auVar101);
          auVar175._0_4_ = auVar136._0_4_ * auVar146._0_4_;
          auVar175._4_4_ = auVar136._4_4_ * auVar146._4_4_;
          auVar175._8_4_ = auVar136._8_4_ * auVar146._8_4_;
          auVar175._12_4_ = auVar136._12_4_ * auVar146._12_4_;
          auVar175._16_4_ = auVar146._16_4_ * 0.0;
          auVar175._20_4_ = auVar146._20_4_ * 0.0;
          auVar175._24_4_ = auVar146._24_4_ * 0.0;
          auVar175._28_4_ = 0;
          auVar99 = vfmadd231ps_fma(auVar175,auVar109,ZEXT1632(auVar99));
          auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),ZEXT1632(auVar98),auVar131);
          fVar134 = auVar15._0_4_;
          fVar111 = auVar15._4_4_;
          fVar112 = auVar15._8_4_;
          fVar113 = auVar15._12_4_;
          auVar101 = ZEXT1632(CONCAT412(fVar113 * auVar99._12_4_,
                                        CONCAT48(fVar112 * auVar99._8_4_,
                                                 CONCAT44(fVar111 * auVar99._4_4_,
                                                          fVar134 * auVar99._0_4_))));
          auVar108._4_4_ = local_520;
          auVar108._0_4_ = local_520;
          auVar108._8_4_ = local_520;
          auVar108._12_4_ = local_520;
          auVar108._16_4_ = local_520;
          auVar108._20_4_ = local_520;
          auVar108._24_4_ = local_520;
          auVar108._28_4_ = local_520;
          uVar94 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar127._4_4_ = uVar94;
          auVar127._0_4_ = uVar94;
          auVar127._8_4_ = uVar94;
          auVar127._12_4_ = uVar94;
          auVar127._16_4_ = uVar94;
          auVar127._20_4_ = uVar94;
          auVar127._24_4_ = uVar94;
          auVar127._28_4_ = uVar94;
          auVar131 = vcmpps_avx(auVar108,auVar101,2);
          auVar109 = vcmpps_avx(auVar101,auVar127,2);
          auVar131 = vandps_avx(auVar109,auVar131);
          auVar15 = vpackssdw_avx(auVar131._0_16_,auVar131._16_16_);
          auVar14 = vpand_avx(auVar14,auVar15);
          auVar131 = vpmovsxwd_avx2(auVar14);
          if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar131 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar131 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar131 >> 0x7f,0) == '\0') &&
                (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar131 >> 0xbf,0) == '\0') &&
              (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar131[0x1f]) goto LAB_0164618b;
          auVar131 = vcmpps_avx(ZEXT1632(auVar19),ZEXT832(0) << 0x20,4);
          auVar15 = vpackssdw_avx(auVar131._0_16_,auVar131._16_16_);
          auVar14 = vpand_avx(auVar14,auVar15);
          auVar131 = vpmovsxwd_avx2(auVar14);
          auVar178 = ZEXT3264(CONCAT824(uStack_528,
                                        CONCAT816(uStack_530,CONCAT88(uStack_538,local_540))));
          auVar204 = ZEXT3264(auVar203);
          if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar131 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar131 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar131 >> 0x7f,0) != '\0') ||
                (auVar131 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar131 >> 0xbf,0) != '\0') ||
              (auVar131 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar131[0x1f] < '\0') {
            auVar109 = ZEXT1632(CONCAT412(fVar113 * auVar16._12_4_,
                                          CONCAT48(fVar112 * auVar16._8_4_,
                                                   CONCAT44(fVar111 * auVar16._4_4_,
                                                            fVar134 * auVar16._0_4_))));
            auVar40._28_4_ = local_460._28_4_;
            auVar40._0_28_ =
                 ZEXT1628(CONCAT412(fVar113 * auVar18._12_4_,
                                    CONCAT48(fVar112 * auVar18._8_4_,
                                             CONCAT44(fVar111 * auVar18._4_4_,
                                                      fVar134 * auVar18._0_4_))));
            auVar159._8_4_ = 0x3f800000;
            auVar159._0_8_ = 0x3f8000003f800000;
            auVar159._12_4_ = 0x3f800000;
            auVar159._16_4_ = 0x3f800000;
            auVar159._20_4_ = 0x3f800000;
            auVar159._24_4_ = 0x3f800000;
            auVar159._28_4_ = 0x3f800000;
            auVar203 = vsubps_avx(auVar159,auVar109);
            auVar203 = vblendvps_avx(auVar203,auVar109,auVar103);
            auVar204 = ZEXT3264(auVar203);
            auVar203 = vsubps_avx(auVar159,auVar40);
            local_360 = vblendvps_avx(auVar203,auVar40,auVar103);
            auVar178 = ZEXT3264(auVar131);
            local_460 = auVar101;
          }
        }
        auVar210 = ZEXT3264(_local_5a0);
        auVar131 = auVar178._0_32_;
        if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar131 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar131 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar131 >> 0x7f,0) == '\0') &&
              (auVar178 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar131 >> 0xbf,0) == '\0') &&
            (auVar178 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar178[0x1f]) goto LAB_01644cea;
        auVar203 = vsubps_avx(ZEXT1632(auVar119),auVar174);
        local_700 = auVar204._0_32_;
        auVar14 = vfmadd213ps_fma(auVar203,local_700,auVar174);
        fVar134 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
        auVar203._4_4_ = (auVar14._4_4_ + auVar14._4_4_) * fVar134;
        auVar203._0_4_ = (auVar14._0_4_ + auVar14._0_4_) * fVar134;
        auVar203._8_4_ = (auVar14._8_4_ + auVar14._8_4_) * fVar134;
        auVar203._12_4_ = (auVar14._12_4_ + auVar14._12_4_) * fVar134;
        auVar203._16_4_ = fVar134 * 0.0;
        auVar203._20_4_ = fVar134 * 0.0;
        auVar203._24_4_ = fVar134 * 0.0;
        auVar203._28_4_ = 0;
        auVar203 = vcmpps_avx(local_460,auVar203,6);
        auVar109 = auVar131 & auVar203;
        auVar182 = ZEXT3264(CONCAT428(local_6e0,
                                      CONCAT424(local_6e0,
                                                CONCAT420(local_6e0,
                                                          CONCAT416(local_6e0,
                                                                    CONCAT412(local_6e0,
                                                                              CONCAT48(local_6e0,
                                                                                       CONCAT44(
                                                  local_6e0,local_6e0))))))));
        auVar178 = ZEXT3264(CONCAT428(fVar217,CONCAT424(fVar212,CONCAT420(fVar217,CONCAT416(fVar212,
                                                  CONCAT412(fVar217,CONCAT48(fVar212,uVar95)))))));
        auVar186 = ZEXT3264(local_6c0);
        if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar109 >> 0x7f,0) != '\0') ||
              (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar109 >> 0xbf,0) != '\0') ||
            (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar109[0x1f] < '\0') {
          auVar128._8_4_ = 0xbf800000;
          auVar128._0_8_ = 0xbf800000bf800000;
          auVar128._12_4_ = 0xbf800000;
          auVar128._16_4_ = 0xbf800000;
          auVar128._20_4_ = 0xbf800000;
          auVar128._24_4_ = 0xbf800000;
          auVar128._28_4_ = 0xbf800000;
          auVar145._8_4_ = 0x40000000;
          auVar145._0_8_ = 0x4000000040000000;
          auVar145._12_4_ = 0x40000000;
          auVar145._16_4_ = 0x40000000;
          auVar145._20_4_ = 0x40000000;
          auVar145._24_4_ = 0x40000000;
          auVar145._28_4_ = 0x40000000;
          auVar14 = vfmadd213ps_fma(local_360,auVar145,auVar128);
          local_240 = ZEXT1632(auVar14);
          local_200 = 0;
          local_360 = local_240;
          if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            auVar153 = ZEXT3264(local_6a0);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (bVar87 = true, pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar131 = vandps_avx(auVar203,auVar131);
              fVar134 = 1.0 / auVar104._0_4_;
              local_180[0] = fVar134 * (auVar204._0_4_ + 0.0);
              local_180[1] = fVar134 * (auVar204._4_4_ + 1.0);
              local_180[2] = fVar134 * (auVar204._8_4_ + 2.0);
              local_180[3] = fVar134 * (auVar204._12_4_ + 3.0);
              fStack_170 = fVar134 * (auVar204._16_4_ + 4.0);
              fStack_16c = fVar134 * (auVar204._20_4_ + 5.0);
              fStack_168 = fVar134 * (auVar204._24_4_ + 6.0);
              fStack_164 = auVar204._28_4_ + 7.0;
              local_360._0_8_ = auVar14._0_8_;
              local_360._8_8_ = auVar14._8_8_;
              local_160 = local_360._0_8_;
              uStack_158 = local_360._8_8_;
              uStack_150 = 0;
              uStack_148 = 0;
              local_140 = local_460;
              uVar88 = vmovmskps_avx(auVar131);
              if (uVar88 == 0) goto LAB_01644db9;
              uVar89 = 0;
              uVar91 = (ulong)(uVar88 & 0xff);
              for (uVar90 = uVar91; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x8000000000000000) {
                uVar89 = uVar89 + 1;
              }
              local_820._0_4_ = local_820._4_4_;
              local_820._8_4_ = local_820._4_4_;
              local_820._12_4_ = local_820._4_4_;
              local_600._0_4_ = local_600._4_4_;
              local_600._8_4_ = local_600._4_4_;
              local_600._16_16_ = auVar146._16_16_;
              local_600._12_4_ = local_600._4_4_;
              local_580 = ZEXT1632(*local_638);
              local_4c0 = ZEXT1632(CONCAT124(auVar17._4_12_,*(undefined4 *)(ray + k * 4 + 0x80)));
              _local_4e0 = auVar129;
              local_260 = local_700;
              local_220 = local_460;
              local_1fc = iVar11;
              local_1f0 = local_650;
              uStack_1e8 = uStack_648;
              local_1e0 = local_660;
              uStack_1d8 = uStack_658;
              local_1d0 = local_670;
              uStack_1c8 = uStack_668;
              do {
                local_3e0 = local_180[uVar89];
                local_3d0 = *(undefined4 *)((long)&local_160 + uVar89 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_140 + uVar89 * 4);
                fVar112 = 1.0 - local_3e0;
                auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar112 * fVar112)),
                                          ZEXT416((uint)(local_3e0 * fVar112)),ZEXT416(0xc0000000));
                auVar14 = vfmsub132ss_fma(ZEXT416((uint)(local_3e0 * fVar112)),
                                          ZEXT416((uint)(local_3e0 * local_3e0)),ZEXT416(0x40000000)
                                         );
                fVar134 = auVar14._0_4_ * 3.0;
                fVar111 = local_3e0 * local_3e0 * 3.0;
                auVar163._0_4_ = fVar111 * local_5b0;
                auVar163._4_4_ = fVar111 * fStack_5ac;
                auVar163._8_4_ = fVar111 * fStack_5a8;
                auVar163._12_4_ = fVar111 * fStack_5a4;
                auVar137._4_4_ = fVar134;
                auVar137._0_4_ = fVar134;
                auVar137._8_4_ = fVar134;
                auVar137._12_4_ = fVar134;
                auVar75._8_8_ = uStack_668;
                auVar75._0_8_ = local_670;
                auVar14 = vfmadd132ps_fma(auVar137,auVar163,auVar75);
                fVar134 = auVar15._0_4_ * 3.0;
                auVar157._4_4_ = fVar134;
                auVar157._0_4_ = fVar134;
                auVar157._8_4_ = fVar134;
                auVar157._12_4_ = fVar134;
                auVar77._8_8_ = uStack_658;
                auVar77._0_8_ = local_660;
                auVar14 = vfmadd132ps_fma(auVar157,auVar14,auVar77);
                fVar134 = fVar112 * fVar112 * -3.0;
                local_630.context = context->user;
                auVar138._4_4_ = fVar134;
                auVar138._0_4_ = fVar134;
                auVar138._8_4_ = fVar134;
                auVar138._12_4_ = fVar134;
                auVar79._8_8_ = uStack_648;
                auVar79._0_8_ = local_650;
                auVar14 = vfmadd132ps_fma(auVar138,auVar14,auVar79);
                local_410 = auVar14._0_4_;
                local_400 = vshufps_avx(auVar14,auVar14,0x55);
                local_3f0 = vshufps_avx(auVar14,auVar14,0xaa);
                local_3c0 = local_600._0_8_;
                uStack_3b8 = local_600._8_8_;
                local_3b0 = local_820;
                vpcmpeqd_avx2(ZEXT1632(local_820),ZEXT1632(local_820));
                uStack_39c = (local_630.context)->instID[0];
                local_3a0 = uStack_39c;
                uStack_398 = uStack_39c;
                uStack_394 = uStack_39c;
                uStack_390 = (local_630.context)->instPrimID[0];
                uStack_38c = uStack_390;
                uStack_388 = uStack_390;
                uStack_384 = uStack_390;
                local_720 = local_580._0_16_;
                local_630.valid = (int *)local_720;
                local_630.geometryUserPtr = pGVar12->userPtr;
                local_630.hit = (RTCHitN *)&local_410;
                local_630.N = 4;
                local_630.ray = (RTCRayN *)ray;
                uStack_40c = local_410;
                uStack_408 = local_410;
                uStack_404 = local_410;
                fStack_3dc = local_3e0;
                fStack_3d8 = local_3e0;
                fStack_3d4 = local_3e0;
                uStack_3cc = local_3d0;
                uStack_3c8 = local_3d0;
                uStack_3c4 = local_3d0;
                if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar12->occlusionFilterN)(&local_630);
                  auVar210 = ZEXT3264(_local_5a0);
                  auVar186 = ZEXT3264(local_6c0);
                  auVar182 = ZEXT3264(CONCAT428(fStack_6c4,
                                                CONCAT424(fStack_6c8,
                                                          CONCAT420(fStack_6cc,
                                                                    CONCAT416(fStack_6d0,
                                                                              CONCAT412(fStack_6d4,
                                                                                        CONCAT48(
                                                  fStack_6d8,CONCAT44(fStack_6dc,local_6e0))))))));
                  auVar204 = ZEXT3264(local_700);
                }
                if (local_720 == (undefined1  [16])0x0) {
                  auVar14 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                  auVar14 = auVar14 ^ _DAT_01f7ae20;
                  auVar178 = ZEXT3264(CONCAT428(fVar217,CONCAT424(fVar212,CONCAT420(fVar217,
                                                  CONCAT416(fVar212,CONCAT412(fVar217,CONCAT48(
                                                  fVar212,uVar95)))))));
                  auVar153 = ZEXT3264(local_6a0);
                }
                else {
                  p_Var13 = context->args->filter;
                  if (p_Var13 == (RTCFilterFunctionN)0x0) {
                    auVar178 = ZEXT3264(CONCAT428(fVar217,CONCAT424(fVar212,CONCAT420(fVar217,
                                                  CONCAT416(fVar212,CONCAT412(fVar217,CONCAT48(
                                                  fVar212,uVar95)))))));
                    auVar153 = ZEXT3264(local_6a0);
                  }
                  else {
                    auVar178 = ZEXT3264(CONCAT428(fVar217,CONCAT424(fVar212,CONCAT420(fVar217,
                                                  CONCAT416(fVar212,CONCAT412(fVar217,CONCAT48(
                                                  fVar212,uVar95)))))));
                    auVar153 = ZEXT3264(local_6a0);
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((pGVar12->field_8).field_0x2 & 0x40) != 0)) {
                      (*p_Var13)(&local_630);
                      auVar210 = ZEXT3264(_local_5a0);
                      auVar153 = ZEXT3264(local_6a0);
                      auVar186 = ZEXT3264(local_6c0);
                      auVar178 = ZEXT3264(CONCAT428(fVar217,CONCAT424(fVar212,CONCAT420(fVar217,
                                                  CONCAT416(fVar212,CONCAT412(fVar217,CONCAT48(
                                                  fVar212,uVar95)))))));
                      auVar182 = ZEXT3264(CONCAT428(fStack_6c4,
                                                    CONCAT424(fStack_6c8,
                                                              CONCAT420(fStack_6cc,
                                                                        CONCAT416(fStack_6d0,
                                                                                  CONCAT412(
                                                  fStack_6d4,
                                                  CONCAT48(fStack_6d8,CONCAT44(fStack_6dc,local_6e0)
                                                          )))))));
                      auVar204 = ZEXT3264(local_700);
                    }
                  }
                  auVar15 = vpcmpeqd_avx(local_720,_DAT_01f7aa10);
                  auVar14 = auVar15 ^ _DAT_01f7ae20;
                  auVar139._8_4_ = 0xff800000;
                  auVar139._0_8_ = 0xff800000ff800000;
                  auVar139._12_4_ = 0xff800000;
                  auVar15 = vblendvps_avx(auVar139,*(undefined1 (*) [16])(local_630.ray + 0x80),
                                          auVar15);
                  *(undefined1 (*) [16])(local_630.ray + 0x80) = auVar15;
                }
                auVar121._8_8_ = 0x100000001;
                auVar121._0_8_ = 0x100000001;
                if ((auVar121 & auVar14) != (undefined1  [16])0x0) {
                  bVar87 = true;
                  break;
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = local_4c0._0_4_;
                uVar90 = uVar89 & 0x3f;
                bVar87 = false;
                uVar89 = 0;
                uVar91 = uVar91 ^ 1L << uVar90;
                for (uVar90 = uVar91; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x8000000000000000)
                {
                  uVar89 = uVar89 + 1;
                }
              } while (uVar91 != 0);
            }
            goto LAB_01644d0e;
          }
          goto LAB_01644d05;
        }
LAB_01644db9:
        auVar153 = ZEXT3264(local_6a0);
        bVar87 = false;
      }
LAB_01644d0e:
      auVar199 = ZEXT3264(auVar149);
      auVar192 = ZEXT3264(auVar192._0_32_);
      auVar133 = ZEXT3264(local_5e0);
      if (8 < iVar11) {
        local_340._4_4_ = fVar135;
        local_340._0_4_ = fVar135;
        fStack_338 = fVar135;
        fStack_334 = fVar135;
        fStack_330 = fVar135;
        fStack_32c = fVar135;
        fStack_328 = fVar135;
        fStack_324 = fVar135;
        local_100 = local_520;
        uStack_fc = local_520;
        uStack_f8 = local_520;
        uStack_f4 = local_520;
        uStack_f0 = local_520;
        uStack_ec = local_520;
        uStack_e8 = local_520;
        uStack_e4 = local_520;
        local_120 = 1.0 / (float)local_440._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        local_2b0 = (undefined4)local_708;
        uStack_2ac = (undefined4)local_708;
        uStack_2a8 = (undefined4)local_708;
        uStack_2a4 = (undefined4)local_708;
        local_5c0 = CONCAT44((undefined4)local_5c0,(undefined4)local_5c0);
        uStack_5b8 = (undefined4)local_5c0;
        uStack_5b4 = (undefined4)local_5c0;
        lVar92 = 8;
        local_700 = auVar204._0_32_;
        _local_5a0 = auVar210._0_32_;
        local_320 = (float)iVar11;
        fStack_31c = (float)iVar11;
        fStack_318 = (float)iVar11;
        fStack_314 = (float)iVar11;
        fStack_310 = (float)iVar11;
        fStack_30c = (float)iVar11;
        fStack_308 = (float)iVar11;
        iStack_304 = iVar11;
        do {
          auVar103 = auVar192._0_32_;
          local_5e0 = auVar133._0_32_;
          auVar131 = *(undefined1 (*) [32])(bezier_basis0 + lVar92 * 4 + lVar23);
          auVar203 = *(undefined1 (*) [32])(lVar23 + 0x21aa768 + lVar92 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar23 + 0x21aabec + lVar92 * 4);
          pauVar5 = (undefined1 (*) [32])(lVar23 + 0x21ab070 + lVar92 * 4);
          fVar116 = *(float *)*pauVar5;
          fVar205 = *(float *)(*pauVar5 + 4);
          fVar211 = *(float *)(*pauVar5 + 8);
          fVar218 = *(float *)(*pauVar5 + 0xc);
          fVar219 = *(float *)(*pauVar5 + 0x10);
          fVar220 = *(float *)(*pauVar5 + 0x14);
          fVar221 = *(float *)(*pauVar5 + 0x18);
          auVar85 = *(undefined1 (*) [28])*pauVar5;
          auVar209._0_4_ = auVar182._0_4_ * fVar116;
          auVar209._4_4_ = auVar182._4_4_ * fVar205;
          auVar209._8_4_ = auVar182._8_4_ * fVar211;
          auVar209._12_4_ = auVar182._12_4_ * fVar218;
          auVar209._16_4_ = auVar182._16_4_ * fVar219;
          auVar209._20_4_ = auVar182._20_4_ * fVar220;
          auVar209._28_36_ = auVar210._28_36_;
          auVar209._24_4_ = auVar182._24_4_ * fVar221;
          auVar192._0_4_ = auVar178._0_4_ * fVar116;
          auVar192._4_4_ = auVar178._4_4_ * fVar205;
          auVar192._8_4_ = auVar178._8_4_ * fVar211;
          auVar192._12_4_ = auVar178._12_4_ * fVar218;
          auVar192._16_4_ = auVar178._16_4_ * fVar219;
          auVar192._20_4_ = auVar178._20_4_ * fVar220;
          auVar192._28_36_ = auVar133._28_36_;
          auVar192._24_4_ = auVar178._24_4_ * fVar221;
          auVar14 = vfmadd231ps_fma(auVar209._0_32_,auVar109,auVar143);
          auVar15 = vfmadd231ps_fma(auVar192._0_32_,auVar109,auVar165);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar203,auVar186._0_32_);
          auVar198 = auVar199._0_32_;
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar203,auVar198);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar131,auVar153._0_32_);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar131,local_500);
          auVar110 = *(undefined1 (*) [32])(bezier_basis1 + lVar92 * 4 + lVar23);
          pauVar6 = (undefined1 (*) [32])(lVar23 + 0x21acb88 + lVar92 * 4);
          uStack_510 = *(undefined4 *)(*pauVar6 + 0x10);
          uStack_50c = *(undefined4 *)(*pauVar6 + 0x14);
          uStack_508 = *(undefined4 *)(*pauVar6 + 0x18);
          uStack_504 = *(undefined4 *)(*pauVar6 + 0x1c);
          auVar20 = *pauVar6;
          auVar146 = *(undefined1 (*) [32])(lVar23 + 0x21ad00c + lVar92 * 4);
          pfVar7 = (float *)(lVar23 + 0x21ad490 + lVar92 * 4);
          fVar222 = *pfVar7;
          fVar69 = pfVar7[1];
          fVar70 = pfVar7[2];
          fVar71 = pfVar7[3];
          fVar72 = pfVar7[4];
          fVar73 = pfVar7[5];
          fVar74 = pfVar7[6];
          auVar210._0_4_ = auVar182._0_4_ * fVar222;
          auVar210._4_4_ = auVar182._4_4_ * fVar69;
          auVar210._8_4_ = auVar182._8_4_ * fVar70;
          auVar210._12_4_ = auVar182._12_4_ * fVar71;
          auVar210._16_4_ = auVar182._16_4_ * fVar72;
          auVar210._20_4_ = auVar182._20_4_ * fVar73;
          auVar210._28_36_ = auVar182._28_36_;
          auVar210._24_4_ = auVar182._24_4_ * fVar74;
          auVar129._4_4_ = auVar178._4_4_ * fVar69;
          auVar129._0_4_ = auVar178._0_4_ * fVar222;
          auVar129._8_4_ = auVar178._8_4_ * fVar70;
          auVar129._12_4_ = auVar178._12_4_ * fVar71;
          auVar129._16_4_ = auVar178._16_4_ * fVar72;
          auVar129._20_4_ = auVar178._20_4_ * fVar73;
          auVar129._24_4_ = auVar178._24_4_ * fVar74;
          auVar129._28_4_ = uStack_504;
          auVar16 = vfmadd231ps_fma(auVar210._0_32_,auVar146,auVar143);
          auVar17 = vfmadd231ps_fma(auVar129,auVar146,auVar165);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar20,auVar186._0_32_);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar20,auVar198);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar110,auVar153._0_32_);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar110,local_500);
          local_300 = ZEXT1632(auVar16);
          local_4c0 = ZEXT1632(auVar14);
          auVar173 = vsubps_avx(local_300,local_4c0);
          local_580 = ZEXT1632(auVar17);
          auVar129 = ZEXT1632(auVar15);
          local_2e0 = vsubps_avx(local_580,auVar129);
          auVar68._4_4_ = auVar173._4_4_ * auVar15._4_4_;
          auVar68._0_4_ = auVar173._0_4_ * auVar15._0_4_;
          auVar68._8_4_ = auVar173._8_4_ * auVar15._8_4_;
          auVar68._12_4_ = auVar173._12_4_ * auVar15._12_4_;
          auVar68._16_4_ = auVar173._16_4_ * 0.0;
          auVar68._20_4_ = auVar173._20_4_ * 0.0;
          auVar68._24_4_ = auVar173._24_4_ * 0.0;
          auVar68._28_4_ = local_500._28_4_;
          fVar135 = local_2e0._0_4_;
          auVar130._0_4_ = auVar14._0_4_ * fVar135;
          fVar134 = local_2e0._4_4_;
          auVar130._4_4_ = auVar14._4_4_ * fVar134;
          fVar111 = local_2e0._8_4_;
          auVar130._8_4_ = auVar14._8_4_ * fVar111;
          fVar112 = local_2e0._12_4_;
          auVar130._12_4_ = auVar14._12_4_ * fVar112;
          fVar113 = local_2e0._16_4_;
          auVar130._16_4_ = fVar113 * 0.0;
          fVar114 = local_2e0._20_4_;
          auVar130._20_4_ = fVar114 * 0.0;
          fVar115 = local_2e0._24_4_;
          auVar130._24_4_ = fVar115 * 0.0;
          auVar130._28_4_ = 0;
          auVar210 = ZEXT3264(auVar109);
          auVar191 = vsubps_avx(auVar68,auVar130);
          auVar182._0_4_ = (float)local_e0 * fVar116;
          auVar182._4_4_ = local_e0._4_4_ * fVar205;
          auVar182._8_4_ = (float)uStack_d8 * fVar211;
          auVar182._12_4_ = uStack_d8._4_4_ * fVar218;
          auVar182._16_4_ = (float)uStack_d0 * fVar219;
          auVar182._20_4_ = uStack_d0._4_4_ * fVar220;
          auVar182._28_36_ = auVar178._28_36_;
          auVar182._24_4_ = (float)uStack_c8 * fVar221;
          auVar14 = vfmadd231ps_fma(auVar182._0_32_,auVar109,local_c0);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar203,local_a0);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),local_80,auVar131);
          auVar41._4_4_ = local_e0._4_4_ * fVar69;
          auVar41._0_4_ = (float)local_e0 * fVar222;
          auVar41._8_4_ = (float)uStack_d8 * fVar70;
          auVar41._12_4_ = uStack_d8._4_4_ * fVar71;
          auVar41._16_4_ = (float)uStack_d0 * fVar72;
          auVar41._20_4_ = uStack_d0._4_4_ * fVar73;
          auVar41._24_4_ = (float)uStack_c8 * fVar74;
          auVar41._28_4_ = uStack_c8._4_4_;
          auVar16 = vfmadd231ps_fma(auVar41,auVar146,local_c0);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar20,local_a0);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar110,local_80);
          auVar42._4_4_ = fVar134 * fVar134;
          auVar42._0_4_ = fVar135 * fVar135;
          auVar42._8_4_ = fVar111 * fVar111;
          auVar42._12_4_ = fVar112 * fVar112;
          auVar42._16_4_ = fVar113 * fVar113;
          auVar42._20_4_ = fVar114 * fVar114;
          auVar42._24_4_ = fVar115 * fVar115;
          auVar42._28_4_ = local_80._28_4_;
          auVar17 = vfmadd231ps_fma(auVar42,auVar173,auVar173);
          auVar101 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(auVar16));
          auVar188._0_4_ = auVar101._0_4_ * auVar101._0_4_ * auVar17._0_4_;
          auVar188._4_4_ = auVar101._4_4_ * auVar101._4_4_ * auVar17._4_4_;
          auVar188._8_4_ = auVar101._8_4_ * auVar101._8_4_ * auVar17._8_4_;
          auVar188._12_4_ = auVar101._12_4_ * auVar101._12_4_ * auVar17._12_4_;
          auVar188._16_4_ = auVar101._16_4_ * auVar101._16_4_ * 0.0;
          auVar188._20_4_ = auVar101._20_4_ * auVar101._20_4_ * 0.0;
          auVar188._24_4_ = auVar101._24_4_ * auVar101._24_4_ * 0.0;
          auVar188._28_4_ = 0;
          auVar43._4_4_ = auVar191._4_4_ * auVar191._4_4_;
          auVar43._0_4_ = auVar191._0_4_ * auVar191._0_4_;
          auVar43._8_4_ = auVar191._8_4_ * auVar191._8_4_;
          auVar43._12_4_ = auVar191._12_4_ * auVar191._12_4_;
          auVar43._16_4_ = auVar191._16_4_ * auVar191._16_4_;
          auVar43._20_4_ = auVar191._20_4_ * auVar191._20_4_;
          auVar43._24_4_ = auVar191._24_4_ * auVar191._24_4_;
          auVar43._28_4_ = auVar191._28_4_;
          auVar101 = vcmpps_avx(auVar43,auVar188,2);
          local_200 = (int)lVar92;
          auVar189._4_4_ = local_200;
          auVar189._0_4_ = local_200;
          auVar189._8_4_ = local_200;
          auVar189._12_4_ = local_200;
          auVar189._16_4_ = local_200;
          auVar189._20_4_ = local_200;
          auVar189._24_4_ = local_200;
          auVar189._28_4_ = local_200;
          auVar191 = vpor_avx2(auVar189,_DAT_01fe9900);
          auVar83._4_4_ = fStack_31c;
          auVar83._0_4_ = local_320;
          auVar83._8_4_ = fStack_318;
          auVar83._12_4_ = fStack_314;
          auVar83._16_4_ = fStack_310;
          auVar83._20_4_ = fStack_30c;
          auVar83._24_4_ = fStack_308;
          auVar83._28_4_ = iStack_304;
          auVar167 = vpcmpgtd_avx2(auVar83,auVar191);
          auVar191 = auVar167 & auVar101;
          if ((((((((auVar191 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar191 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar191 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar191 >> 0x7f,0) == '\0') &&
                (auVar191 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar191 >> 0xbf,0) == '\0') &&
              (auVar191 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar191[0x1f]) {
            auVar192 = ZEXT3264(auVar103);
            auVar199 = ZEXT3264(auVar198);
LAB_01645b93:
            auVar133 = ZEXT3264(local_5e0);
            auVar182 = ZEXT3264(CONCAT428(fStack_6c4,
                                          CONCAT424(fStack_6c8,
                                                    CONCAT420(fStack_6cc,
                                                              CONCAT416(fStack_6d0,
                                                                        CONCAT412(fStack_6d4,
                                                                                  CONCAT48(
                                                  fStack_6d8,CONCAT44(fStack_6dc,local_6e0))))))));
            auVar178 = ZEXT3264(CONCAT428(fVar217,CONCAT424(fVar212,CONCAT420(fVar217,CONCAT416(
                                                  fVar212,CONCAT412(fVar217,CONCAT48(fVar212,uVar95)
                                                                   ))))));
            auVar186 = ZEXT3264(local_6c0);
          }
          else {
            local_440 = vandps_avx(auVar167,auVar101);
            auVar44._4_4_ = (float)local_5a0._4_4_ * fVar69;
            auVar44._0_4_ = (float)local_5a0._0_4_ * fVar222;
            auVar44._8_4_ = fStack_598 * fVar70;
            auVar44._12_4_ = fStack_594 * fVar71;
            auVar44._16_4_ = fStack_590 * fVar72;
            auVar44._20_4_ = fStack_58c * fVar73;
            auVar44._24_4_ = fStack_588 * fVar74;
            auVar44._28_4_ = auVar101._28_4_;
            auVar17 = vfmadd213ps_fma(auVar146,local_280,auVar44);
            auVar17 = vfmadd213ps_fma(auVar20,local_480,ZEXT1632(auVar17));
            auVar17 = vfmadd132ps_fma(auVar110,ZEXT1632(auVar17),local_4a0);
            local_4e0._0_4_ = auVar85._0_4_;
            local_4e0._4_4_ = auVar85._4_4_;
            fStack_4d8 = auVar85._8_4_;
            fStack_4d4 = auVar85._12_4_;
            fStack_4d0 = auVar85._16_4_;
            fStack_4cc = auVar85._20_4_;
            fStack_4c8 = auVar85._24_4_;
            auVar45._4_4_ = (float)local_5a0._4_4_ * (float)local_4e0._4_4_;
            auVar45._0_4_ = (float)local_5a0._0_4_ * (float)local_4e0._0_4_;
            auVar45._8_4_ = fStack_598 * fStack_4d8;
            auVar45._12_4_ = fStack_594 * fStack_4d4;
            auVar45._16_4_ = fStack_590 * fStack_4d0;
            auVar45._20_4_ = fStack_58c * fStack_4cc;
            auVar45._24_4_ = fStack_588 * fStack_4c8;
            auVar45._28_4_ = auVar101._28_4_;
            auVar18 = vfmadd213ps_fma(auVar109,local_280,auVar45);
            auVar18 = vfmadd213ps_fma(auVar203,local_480,ZEXT1632(auVar18));
            auVar203 = *(undefined1 (*) [32])(lVar23 + 0x21ab4f4 + lVar92 * 4);
            auVar109 = *(undefined1 (*) [32])(lVar23 + 0x21ab978 + lVar92 * 4);
            auVar146 = *(undefined1 (*) [32])(lVar23 + 0x21abdfc + lVar92 * 4);
            pfVar7 = (float *)(lVar23 + 0x21ac280 + lVar92 * 4);
            fVar135 = *pfVar7;
            fVar134 = pfVar7[1];
            fVar111 = pfVar7[2];
            fVar112 = pfVar7[3];
            fVar113 = pfVar7[4];
            fVar114 = pfVar7[5];
            fVar115 = pfVar7[6];
            auVar46._4_4_ = fStack_6dc * fVar134;
            auVar46._0_4_ = local_6e0 * fVar135;
            auVar46._8_4_ = fStack_6d8 * fVar111;
            auVar46._12_4_ = fStack_6d4 * fVar112;
            auVar46._16_4_ = fStack_6d0 * fVar113;
            auVar46._20_4_ = fStack_6cc * fVar114;
            auVar46._24_4_ = fStack_6c8 * fVar115;
            auVar46._28_4_ = auVar173._28_4_;
            auVar207._0_4_ = fVar212 * fVar135;
            auVar207._4_4_ = fVar217 * fVar134;
            auVar207._8_4_ = fVar212 * fVar111;
            auVar207._12_4_ = fVar217 * fVar112;
            auVar207._16_4_ = fVar212 * fVar113;
            auVar207._20_4_ = fVar217 * fVar114;
            auVar207._24_4_ = fVar212 * fVar115;
            auVar207._28_4_ = 0;
            auVar47._4_4_ = fVar134 * (float)local_5a0._4_4_;
            auVar47._0_4_ = fVar135 * (float)local_5a0._0_4_;
            auVar47._8_4_ = fVar111 * fStack_598;
            auVar47._12_4_ = fVar112 * fStack_594;
            auVar47._16_4_ = fVar113 * fStack_590;
            auVar47._20_4_ = fVar114 * fStack_58c;
            auVar47._24_4_ = fVar115 * fStack_588;
            auVar47._28_4_ = pfVar7[7];
            auVar19 = vfmadd231ps_fma(auVar46,auVar146,auVar143);
            auVar99 = vfmadd231ps_fma(auVar207,auVar146,auVar165);
            auVar98 = vfmadd231ps_fma(auVar47,local_280,auVar146);
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar109,local_6c0);
            auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar109,auVar149);
            auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),local_480,auVar109);
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar203,local_6a0);
            auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar203,local_500);
            auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),local_4a0,auVar203);
            pfVar7 = (float *)(lVar23 + 0x21ae6a0 + lVar92 * 4);
            fVar135 = *pfVar7;
            fVar134 = pfVar7[1];
            fVar111 = pfVar7[2];
            fVar112 = pfVar7[3];
            fVar113 = pfVar7[4];
            fVar114 = pfVar7[5];
            fVar115 = pfVar7[6];
            auVar48._4_4_ = fStack_6dc * fVar134;
            auVar48._0_4_ = local_6e0 * fVar135;
            auVar48._8_4_ = fStack_6d8 * fVar111;
            auVar48._12_4_ = fStack_6d4 * fVar112;
            auVar48._16_4_ = fStack_6d0 * fVar113;
            auVar48._20_4_ = fStack_6cc * fVar114;
            auVar48._24_4_ = fStack_6c8 * fVar115;
            auVar48._28_4_ = fStack_6c4;
            auVar49._4_4_ = fVar217 * fVar134;
            auVar49._0_4_ = fVar212 * fVar135;
            auVar49._8_4_ = fVar212 * fVar111;
            auVar49._12_4_ = fVar217 * fVar112;
            auVar49._16_4_ = fVar212 * fVar113;
            auVar49._20_4_ = fVar217 * fVar114;
            auVar49._24_4_ = fVar212 * fVar115;
            auVar49._28_4_ = fVar217;
            auVar50._4_4_ = (float)local_5a0._4_4_ * fVar134;
            auVar50._0_4_ = (float)local_5a0._0_4_ * fVar135;
            auVar50._8_4_ = fStack_598 * fVar111;
            auVar50._12_4_ = fStack_594 * fVar112;
            auVar50._16_4_ = fStack_590 * fVar113;
            auVar50._20_4_ = fStack_58c * fVar114;
            auVar50._24_4_ = fStack_588 * fVar115;
            auVar50._28_4_ = pfVar7[7];
            auVar203 = *(undefined1 (*) [32])(lVar23 + 0x21ae21c + lVar92 * 4);
            auVar136 = vfmadd231ps_fma(auVar48,auVar203,auVar143);
            auVar119 = vfmadd231ps_fma(auVar49,auVar203,auVar165);
            auVar97 = vfmadd231ps_fma(auVar50,local_280,auVar203);
            auVar203 = *(undefined1 (*) [32])(lVar23 + 0x21add98 + lVar92 * 4);
            auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar203,local_6c0);
            auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar203,auVar149);
            auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),local_480,auVar203);
            auVar203 = *(undefined1 (*) [32])(lVar23 + 0x21ad914 + lVar92 * 4);
            auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar203,local_6a0);
            auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar203,local_500);
            auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),local_4a0,auVar203);
            auVar190._8_4_ = 0x7fffffff;
            auVar190._0_8_ = 0x7fffffff7fffffff;
            auVar190._12_4_ = 0x7fffffff;
            auVar190._16_4_ = 0x7fffffff;
            auVar190._20_4_ = 0x7fffffff;
            auVar190._24_4_ = 0x7fffffff;
            auVar190._28_4_ = 0x7fffffff;
            auVar203 = vandps_avx(ZEXT1632(auVar19),auVar190);
            auVar109 = vandps_avx(ZEXT1632(auVar99),auVar190);
            auVar109 = vmaxps_avx(auVar203,auVar109);
            auVar203 = vandps_avx(ZEXT1632(auVar98),auVar190);
            auVar203 = vmaxps_avx(auVar109,auVar203);
            auVar203 = vcmpps_avx(auVar203,_local_340,1);
            auVar146 = vblendvps_avx(ZEXT1632(auVar19),auVar173,auVar203);
            auVar101 = vblendvps_avx(ZEXT1632(auVar99),local_2e0,auVar203);
            auVar203 = vandps_avx(ZEXT1632(auVar136),auVar190);
            auVar109 = vandps_avx(ZEXT1632(auVar119),auVar190);
            auVar109 = vmaxps_avx(auVar203,auVar109);
            auVar203 = vandps_avx(auVar190,ZEXT1632(auVar97));
            auVar203 = vmaxps_avx(auVar109,auVar203);
            auVar109 = vcmpps_avx(auVar203,_local_340,1);
            auVar203 = vblendvps_avx(ZEXT1632(auVar136),auVar173,auVar109);
            auVar109 = vblendvps_avx(ZEXT1632(auVar119),local_2e0,auVar109);
            auVar18 = vfmadd213ps_fma(auVar131,local_4a0,ZEXT1632(auVar18));
            auVar19 = vfmadd213ps_fma(auVar146,auVar146,ZEXT832(0) << 0x20);
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar101,auVar101);
            auVar131 = vrsqrtps_avx(ZEXT1632(auVar19));
            fVar135 = auVar131._0_4_;
            fVar134 = auVar131._4_4_;
            fVar111 = auVar131._8_4_;
            fVar112 = auVar131._12_4_;
            fVar113 = auVar131._16_4_;
            fVar114 = auVar131._20_4_;
            fVar115 = auVar131._24_4_;
            auVar51._4_4_ = fVar134 * fVar134 * fVar134 * auVar19._4_4_ * -0.5;
            auVar51._0_4_ = fVar135 * fVar135 * fVar135 * auVar19._0_4_ * -0.5;
            auVar51._8_4_ = fVar111 * fVar111 * fVar111 * auVar19._8_4_ * -0.5;
            auVar51._12_4_ = fVar112 * fVar112 * fVar112 * auVar19._12_4_ * -0.5;
            auVar51._16_4_ = fVar113 * fVar113 * fVar113 * -0.0;
            auVar51._20_4_ = fVar114 * fVar114 * fVar114 * -0.0;
            auVar51._24_4_ = fVar115 * fVar115 * fVar115 * -0.0;
            auVar51._28_4_ = 0;
            auVar216._8_4_ = 0x3fc00000;
            auVar216._0_8_ = 0x3fc000003fc00000;
            auVar216._12_4_ = 0x3fc00000;
            auVar216._16_4_ = 0x3fc00000;
            auVar216._20_4_ = 0x3fc00000;
            auVar216._24_4_ = 0x3fc00000;
            auVar216._28_4_ = 0x3fc00000;
            auVar19 = vfmadd231ps_fma(auVar51,auVar216,auVar131);
            fVar135 = auVar19._0_4_;
            fVar134 = auVar19._4_4_;
            auVar52._4_4_ = auVar101._4_4_ * fVar134;
            auVar52._0_4_ = auVar101._0_4_ * fVar135;
            fVar111 = auVar19._8_4_;
            auVar52._8_4_ = auVar101._8_4_ * fVar111;
            fVar112 = auVar19._12_4_;
            auVar52._12_4_ = auVar101._12_4_ * fVar112;
            auVar52._16_4_ = auVar101._16_4_ * 0.0;
            auVar52._20_4_ = auVar101._20_4_ * 0.0;
            auVar52._24_4_ = auVar101._24_4_ * 0.0;
            auVar52._28_4_ = auVar131._28_4_;
            auVar53._4_4_ = fVar134 * -auVar146._4_4_;
            auVar53._0_4_ = fVar135 * -auVar146._0_4_;
            auVar53._8_4_ = fVar111 * -auVar146._8_4_;
            auVar53._12_4_ = fVar112 * -auVar146._12_4_;
            auVar53._16_4_ = -auVar146._16_4_ * 0.0;
            auVar53._20_4_ = -auVar146._20_4_ * 0.0;
            auVar53._24_4_ = -auVar146._24_4_ * 0.0;
            auVar53._28_4_ = auVar101._28_4_;
            auVar19 = vfmadd213ps_fma(auVar203,auVar203,ZEXT832(0) << 0x20);
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar109,auVar109);
            auVar131 = vrsqrtps_avx(ZEXT1632(auVar19));
            auVar54._28_4_ = auVar173._28_4_;
            auVar54._0_28_ =
                 ZEXT1628(CONCAT412(fVar112 * 0.0,
                                    CONCAT48(fVar111 * 0.0,CONCAT44(fVar134 * 0.0,fVar135 * 0.0))));
            fVar135 = auVar131._0_4_;
            fVar134 = auVar131._4_4_;
            fVar111 = auVar131._8_4_;
            fVar112 = auVar131._12_4_;
            fVar113 = auVar131._16_4_;
            fVar114 = auVar131._20_4_;
            fVar115 = auVar131._24_4_;
            auVar55._4_4_ = fVar134 * fVar134 * fVar134 * auVar19._4_4_ * -0.5;
            auVar55._0_4_ = fVar135 * fVar135 * fVar135 * auVar19._0_4_ * -0.5;
            auVar55._8_4_ = fVar111 * fVar111 * fVar111 * auVar19._8_4_ * -0.5;
            auVar55._12_4_ = fVar112 * fVar112 * fVar112 * auVar19._12_4_ * -0.5;
            auVar55._16_4_ = fVar113 * fVar113 * fVar113 * -0.0;
            auVar55._20_4_ = fVar114 * fVar114 * fVar114 * -0.0;
            auVar55._24_4_ = fVar115 * fVar115 * fVar115 * -0.0;
            auVar55._28_4_ = 0;
            auVar19 = vfmadd231ps_fma(auVar55,auVar216,auVar131);
            fVar135 = auVar19._0_4_;
            fVar134 = auVar19._4_4_;
            auVar56._4_4_ = auVar109._4_4_ * fVar134;
            auVar56._0_4_ = auVar109._0_4_ * fVar135;
            fVar111 = auVar19._8_4_;
            auVar56._8_4_ = auVar109._8_4_ * fVar111;
            fVar112 = auVar19._12_4_;
            auVar56._12_4_ = auVar109._12_4_ * fVar112;
            auVar56._16_4_ = auVar109._16_4_ * 0.0;
            auVar56._20_4_ = auVar109._20_4_ * 0.0;
            auVar56._24_4_ = auVar109._24_4_ * 0.0;
            auVar56._28_4_ = 0;
            auVar57._4_4_ = fVar134 * -auVar203._4_4_;
            auVar57._0_4_ = fVar135 * -auVar203._0_4_;
            auVar57._8_4_ = fVar111 * -auVar203._8_4_;
            auVar57._12_4_ = fVar112 * -auVar203._12_4_;
            auVar57._16_4_ = -auVar203._16_4_ * 0.0;
            auVar57._20_4_ = -auVar203._20_4_ * 0.0;
            auVar57._24_4_ = -auVar203._24_4_ * 0.0;
            auVar57._28_4_ = auVar131._28_4_;
            auVar58._28_4_ = 0xbf000000;
            auVar58._0_28_ =
                 ZEXT1628(CONCAT412(fVar112 * 0.0,
                                    CONCAT48(fVar111 * 0.0,CONCAT44(fVar134 * 0.0,fVar135 * 0.0))));
            auVar19 = vfmadd213ps_fma(auVar52,ZEXT1632(auVar14),local_4c0);
            auVar131 = ZEXT1632(auVar14);
            auVar99 = vfmadd213ps_fma(auVar53,auVar131,auVar129);
            auVar98 = vfmadd213ps_fma(auVar54,auVar131,ZEXT1632(auVar18));
            auVar120 = vfnmadd213ps_fma(auVar52,auVar131,local_4c0);
            auVar136 = vfmadd213ps_fma(auVar56,ZEXT1632(auVar16),local_300);
            auVar148 = vfnmadd213ps_fma(auVar53,auVar131,auVar129);
            auVar131 = ZEXT1632(auVar16);
            auVar119 = vfmadd213ps_fma(auVar57,auVar131,local_580);
            auVar102 = ZEXT1632(auVar14);
            auVar118 = vfnmadd231ps_fma(ZEXT1632(auVar18),auVar102,auVar54);
            auVar18 = vfmadd213ps_fma(auVar58,auVar131,ZEXT1632(auVar17));
            auVar155 = vfnmadd213ps_fma(auVar56,auVar131,local_300);
            auVar96 = vfnmadd213ps_fma(auVar57,auVar131,local_580);
            auVar154 = vfnmadd231ps_fma(ZEXT1632(auVar17),ZEXT1632(auVar16),auVar58);
            auVar131 = vsubps_avx(ZEXT1632(auVar119),ZEXT1632(auVar148));
            auVar203 = vsubps_avx(ZEXT1632(auVar18),ZEXT1632(auVar118));
            auVar176._0_4_ = auVar131._0_4_ * auVar118._0_4_;
            auVar176._4_4_ = auVar131._4_4_ * auVar118._4_4_;
            auVar176._8_4_ = auVar131._8_4_ * auVar118._8_4_;
            auVar176._12_4_ = auVar131._12_4_ * auVar118._12_4_;
            auVar176._16_4_ = auVar131._16_4_ * 0.0;
            auVar176._20_4_ = auVar131._20_4_ * 0.0;
            auVar176._24_4_ = auVar131._24_4_ * 0.0;
            auVar176._28_4_ = 0;
            auVar97 = vfmsub231ps_fma(auVar176,ZEXT1632(auVar148),auVar203);
            auVar59._4_4_ = auVar120._4_4_ * auVar203._4_4_;
            auVar59._0_4_ = auVar120._0_4_ * auVar203._0_4_;
            auVar59._8_4_ = auVar120._8_4_ * auVar203._8_4_;
            auVar59._12_4_ = auVar120._12_4_ * auVar203._12_4_;
            auVar59._16_4_ = auVar203._16_4_ * 0.0;
            auVar59._20_4_ = auVar203._20_4_ * 0.0;
            auVar59._24_4_ = auVar203._24_4_ * 0.0;
            auVar59._28_4_ = auVar203._28_4_;
            auVar191 = ZEXT1632(auVar120);
            auVar203 = vsubps_avx(ZEXT1632(auVar136),auVar191);
            auVar110 = ZEXT1632(auVar118);
            auVar17 = vfmsub231ps_fma(auVar59,auVar110,auVar203);
            auVar60._4_4_ = auVar148._4_4_ * auVar203._4_4_;
            auVar60._0_4_ = auVar148._0_4_ * auVar203._0_4_;
            auVar60._8_4_ = auVar148._8_4_ * auVar203._8_4_;
            auVar60._12_4_ = auVar148._12_4_ * auVar203._12_4_;
            auVar60._16_4_ = auVar203._16_4_ * 0.0;
            auVar60._20_4_ = auVar203._20_4_ * 0.0;
            auVar60._24_4_ = auVar203._24_4_ * 0.0;
            auVar60._28_4_ = auVar203._28_4_;
            auVar120 = vfmsub231ps_fma(auVar60,auVar191,auVar131);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar120),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar97));
            auVar20 = vcmpps_avx(ZEXT1632(auVar17),ZEXT832(0) << 0x20,2);
            auVar131 = vblendvps_avx(ZEXT1632(auVar155),ZEXT1632(auVar19),auVar20);
            auVar203 = vblendvps_avx(ZEXT1632(auVar96),ZEXT1632(auVar99),auVar20);
            auVar109 = vblendvps_avx(ZEXT1632(auVar154),ZEXT1632(auVar98),auVar20);
            auVar146 = vblendvps_avx(auVar191,ZEXT1632(auVar136),auVar20);
            auVar101 = vblendvps_avx(ZEXT1632(auVar148),ZEXT1632(auVar119),auVar20);
            auVar173 = vblendvps_avx(auVar110,ZEXT1632(auVar18),auVar20);
            auVar191 = vblendvps_avx(ZEXT1632(auVar136),auVar191,auVar20);
            auVar167 = vblendvps_avx(ZEXT1632(auVar119),ZEXT1632(auVar148),auVar20);
            auVar17 = vpackssdw_avx(local_440._0_16_,local_440._16_16_);
            auVar110 = vblendvps_avx(ZEXT1632(auVar18),auVar110,auVar20);
            auVar191 = vsubps_avx(auVar191,auVar131);
            auVar167 = vsubps_avx(auVar167,auVar203);
            auVar129 = vsubps_avx(auVar110,auVar109);
            auVar210 = ZEXT3264(auVar129);
            auVar198 = vsubps_avx(auVar131,auVar146);
            auVar21 = vsubps_avx(auVar203,auVar101);
            auVar22 = vsubps_avx(auVar109,auVar173);
            auVar168._0_4_ = auVar129._0_4_ * auVar131._0_4_;
            auVar168._4_4_ = auVar129._4_4_ * auVar131._4_4_;
            auVar168._8_4_ = auVar129._8_4_ * auVar131._8_4_;
            auVar168._12_4_ = auVar129._12_4_ * auVar131._12_4_;
            auVar168._16_4_ = auVar129._16_4_ * auVar131._16_4_;
            auVar168._20_4_ = auVar129._20_4_ * auVar131._20_4_;
            auVar168._24_4_ = auVar129._24_4_ * auVar131._24_4_;
            auVar168._28_4_ = 0;
            auVar18 = vfmsub231ps_fma(auVar168,auVar109,auVar191);
            auVar61._4_4_ = auVar191._4_4_ * auVar203._4_4_;
            auVar61._0_4_ = auVar191._0_4_ * auVar203._0_4_;
            auVar61._8_4_ = auVar191._8_4_ * auVar203._8_4_;
            auVar61._12_4_ = auVar191._12_4_ * auVar203._12_4_;
            auVar61._16_4_ = auVar191._16_4_ * auVar203._16_4_;
            auVar61._20_4_ = auVar191._20_4_ * auVar203._20_4_;
            auVar61._24_4_ = auVar191._24_4_ * auVar203._24_4_;
            auVar61._28_4_ = auVar110._28_4_;
            auVar19 = vfmsub231ps_fma(auVar61,auVar131,auVar167);
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT1632(auVar18),_DAT_01faff00);
            auVar169._0_4_ = auVar167._0_4_ * auVar109._0_4_;
            auVar169._4_4_ = auVar167._4_4_ * auVar109._4_4_;
            auVar169._8_4_ = auVar167._8_4_ * auVar109._8_4_;
            auVar169._12_4_ = auVar167._12_4_ * auVar109._12_4_;
            auVar169._16_4_ = auVar167._16_4_ * auVar109._16_4_;
            auVar169._20_4_ = auVar167._20_4_ * auVar109._20_4_;
            auVar169._24_4_ = auVar167._24_4_ * auVar109._24_4_;
            auVar169._28_4_ = 0;
            auVar19 = vfmsub231ps_fma(auVar169,auVar203,auVar129);
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar19));
            auVar170._0_4_ = auVar22._0_4_ * auVar146._0_4_;
            auVar170._4_4_ = auVar22._4_4_ * auVar146._4_4_;
            auVar170._8_4_ = auVar22._8_4_ * auVar146._8_4_;
            auVar170._12_4_ = auVar22._12_4_ * auVar146._12_4_;
            auVar170._16_4_ = auVar22._16_4_ * auVar146._16_4_;
            auVar170._20_4_ = auVar22._20_4_ * auVar146._20_4_;
            auVar170._24_4_ = auVar22._24_4_ * auVar146._24_4_;
            auVar170._28_4_ = 0;
            auVar18 = vfmsub231ps_fma(auVar170,auVar198,auVar173);
            auVar62._4_4_ = auVar21._4_4_ * auVar173._4_4_;
            auVar62._0_4_ = auVar21._0_4_ * auVar173._0_4_;
            auVar62._8_4_ = auVar21._8_4_ * auVar173._8_4_;
            auVar62._12_4_ = auVar21._12_4_ * auVar173._12_4_;
            auVar62._16_4_ = auVar21._16_4_ * auVar173._16_4_;
            auVar62._20_4_ = auVar21._20_4_ * auVar173._20_4_;
            auVar62._24_4_ = auVar21._24_4_ * auVar173._24_4_;
            auVar62._28_4_ = auVar173._28_4_;
            auVar99 = vfmsub231ps_fma(auVar62,auVar101,auVar22);
            auVar63._4_4_ = auVar198._4_4_ * auVar101._4_4_;
            auVar63._0_4_ = auVar198._0_4_ * auVar101._0_4_;
            auVar63._8_4_ = auVar198._8_4_ * auVar101._8_4_;
            auVar63._12_4_ = auVar198._12_4_ * auVar101._12_4_;
            auVar63._16_4_ = auVar198._16_4_ * auVar101._16_4_;
            auVar63._20_4_ = auVar198._20_4_ * auVar101._20_4_;
            auVar63._24_4_ = auVar198._24_4_ * auVar101._24_4_;
            auVar63._28_4_ = auVar101._28_4_;
            auVar98 = vfmsub231ps_fma(auVar63,auVar21,auVar146);
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar98),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
            auVar99 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar99));
            auVar146 = vmaxps_avx(ZEXT1632(auVar19),ZEXT1632(auVar99));
            auVar146 = vcmpps_avx(auVar146,ZEXT832(0) << 0x20,2);
            auVar18 = vpackssdw_avx(auVar146._0_16_,auVar146._16_16_);
            auVar18 = vpand_avx(auVar18,auVar17);
            auVar146 = vpmovsxwd_avx2(auVar18);
            if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar146 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar146 >> 0x7f,0) == '\0') &&
                  (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar146 >> 0xbf,0) == '\0') &&
                (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar146[0x1f]) {
LAB_016460c9:
              auVar152._8_8_ = uStack_538;
              auVar152._0_8_ = local_540;
              auVar152._16_8_ = uStack_530;
              auVar152._24_8_ = uStack_528;
              auVar192 = ZEXT3264(auVar103);
            }
            else {
              auVar64._4_4_ = auVar167._4_4_ * auVar22._4_4_;
              auVar64._0_4_ = auVar167._0_4_ * auVar22._0_4_;
              auVar64._8_4_ = auVar167._8_4_ * auVar22._8_4_;
              auVar64._12_4_ = auVar167._12_4_ * auVar22._12_4_;
              auVar64._16_4_ = auVar167._16_4_ * auVar22._16_4_;
              auVar64._20_4_ = auVar167._20_4_ * auVar22._20_4_;
              auVar64._24_4_ = auVar167._24_4_ * auVar22._24_4_;
              auVar64._28_4_ = auVar146._28_4_;
              auVar97 = vfmsub231ps_fma(auVar64,auVar21,auVar129);
              auVar177._0_4_ = auVar129._0_4_ * auVar198._0_4_;
              auVar177._4_4_ = auVar129._4_4_ * auVar198._4_4_;
              auVar177._8_4_ = auVar129._8_4_ * auVar198._8_4_;
              auVar177._12_4_ = auVar129._12_4_ * auVar198._12_4_;
              auVar177._16_4_ = auVar129._16_4_ * auVar198._16_4_;
              auVar177._20_4_ = auVar129._20_4_ * auVar198._20_4_;
              auVar177._24_4_ = auVar129._24_4_ * auVar198._24_4_;
              auVar177._28_4_ = 0;
              auVar119 = vfmsub231ps_fma(auVar177,auVar191,auVar22);
              auVar65._4_4_ = auVar191._4_4_ * auVar21._4_4_;
              auVar65._0_4_ = auVar191._0_4_ * auVar21._0_4_;
              auVar65._8_4_ = auVar191._8_4_ * auVar21._8_4_;
              auVar65._12_4_ = auVar191._12_4_ * auVar21._12_4_;
              auVar65._16_4_ = auVar191._16_4_ * auVar21._16_4_;
              auVar65._20_4_ = auVar191._20_4_ * auVar21._20_4_;
              auVar65._24_4_ = auVar191._24_4_ * auVar21._24_4_;
              auVar65._28_4_ = auVar21._28_4_;
              auVar120 = vfmsub231ps_fma(auVar65,auVar198,auVar167);
              auVar98 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar119),ZEXT1632(auVar120));
              auVar136 = vfmadd231ps_fma(ZEXT1632(auVar98),ZEXT1632(auVar97),ZEXT832(0) << 0x20);
              auVar146 = vrcpps_avx(ZEXT1632(auVar136));
              auVar208._8_4_ = 0x3f800000;
              auVar208._0_8_ = 0x3f8000003f800000;
              auVar208._12_4_ = 0x3f800000;
              auVar208._16_4_ = 0x3f800000;
              auVar208._20_4_ = 0x3f800000;
              auVar208._24_4_ = 0x3f800000;
              auVar208._28_4_ = 0x3f800000;
              auVar210 = ZEXT3264(auVar208);
              auVar98 = vfnmadd213ps_fma(auVar146,ZEXT1632(auVar136),auVar208);
              auVar98 = vfmadd132ps_fma(ZEXT1632(auVar98),auVar146,auVar146);
              auVar150._0_4_ = auVar120._0_4_ * auVar109._0_4_;
              auVar150._4_4_ = auVar120._4_4_ * auVar109._4_4_;
              auVar150._8_4_ = auVar120._8_4_ * auVar109._8_4_;
              auVar150._12_4_ = auVar120._12_4_ * auVar109._12_4_;
              auVar150._16_4_ = auVar109._16_4_ * 0.0;
              auVar150._20_4_ = auVar109._20_4_ * 0.0;
              auVar150._24_4_ = auVar109._24_4_ * 0.0;
              auVar150._28_4_ = 0;
              auVar119 = vfmadd231ps_fma(auVar150,ZEXT1632(auVar119),auVar203);
              auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar131,ZEXT1632(auVar97));
              fVar135 = auVar98._0_4_;
              fVar134 = auVar98._4_4_;
              fVar111 = auVar98._8_4_;
              fVar112 = auVar98._12_4_;
              auVar109 = ZEXT1632(CONCAT412(fVar112 * auVar119._12_4_,
                                            CONCAT48(fVar111 * auVar119._8_4_,
                                                     CONCAT44(fVar134 * auVar119._4_4_,
                                                              fVar135 * auVar119._0_4_))));
              uVar94 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar151._4_4_ = uVar94;
              auVar151._0_4_ = uVar94;
              auVar151._8_4_ = uVar94;
              auVar151._12_4_ = uVar94;
              auVar151._16_4_ = uVar94;
              auVar151._20_4_ = uVar94;
              auVar151._24_4_ = uVar94;
              auVar151._28_4_ = uVar94;
              auVar84._4_4_ = uStack_fc;
              auVar84._0_4_ = local_100;
              auVar84._8_4_ = uStack_f8;
              auVar84._12_4_ = uStack_f4;
              auVar84._16_4_ = uStack_f0;
              auVar84._20_4_ = uStack_ec;
              auVar84._24_4_ = uStack_e8;
              auVar84._28_4_ = uStack_e4;
              auVar131 = vcmpps_avx(auVar84,auVar109,2);
              auVar203 = vcmpps_avx(auVar109,auVar151,2);
              auVar131 = vandps_avx(auVar203,auVar131);
              auVar98 = vpackssdw_avx(auVar131._0_16_,auVar131._16_16_);
              auVar18 = vpand_avx(auVar18,auVar98);
              auVar131 = vpmovsxwd_avx2(auVar18);
              if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar131 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar131 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar131 >> 0x7f,0) == '\0') &&
                    (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar131 >> 0xbf,0) == '\0') &&
                  (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar131[0x1f]) goto LAB_016460c9;
              auVar131 = vcmpps_avx(ZEXT1632(auVar136),ZEXT832(0) << 0x20,4);
              auVar98 = vpackssdw_avx(auVar131._0_16_,auVar131._16_16_);
              auVar18 = vpand_avx(auVar18,auVar98);
              auVar131 = vpmovsxwd_avx2(auVar18);
              auVar152._8_8_ = uStack_538;
              auVar152._0_8_ = local_540;
              auVar152._16_8_ = uStack_530;
              auVar152._24_8_ = uStack_528;
              auVar192 = ZEXT3264(auVar103);
              if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar131 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar131 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar131 >> 0x7f,0) != '\0') ||
                    (auVar131 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar131 >> 0xbf,0) != '\0') ||
                  (auVar131 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar131[0x1f] < '\0') {
                auVar146 = ZEXT1632(CONCAT412(fVar112 * auVar19._12_4_,
                                              CONCAT48(fVar111 * auVar19._8_4_,
                                                       CONCAT44(fVar134 * auVar19._4_4_,
                                                                fVar135 * auVar19._0_4_))));
                auVar66._28_4_ = SUB84(uStack_528,4);
                auVar66._0_28_ =
                     ZEXT1628(CONCAT412(fVar112 * auVar99._12_4_,
                                        CONCAT48(fVar111 * auVar99._8_4_,
                                                 CONCAT44(fVar134 * auVar99._4_4_,
                                                          fVar135 * auVar99._0_4_))));
                auVar185._8_4_ = 0x3f800000;
                auVar185._0_8_ = 0x3f8000003f800000;
                auVar185._12_4_ = 0x3f800000;
                auVar185._16_4_ = 0x3f800000;
                auVar185._20_4_ = 0x3f800000;
                auVar185._24_4_ = 0x3f800000;
                auVar185._28_4_ = 0x3f800000;
                auVar203 = vsubps_avx(auVar185,auVar146);
                local_5e0 = vblendvps_avx(auVar203,auVar146,auVar20);
                auVar203 = vsubps_avx(auVar185,auVar66);
                local_380 = vblendvps_avx(auVar203,auVar66,auVar20);
                auVar192 = ZEXT3264(auVar109);
                auVar152 = auVar131;
              }
            }
            auVar204 = ZEXT3264(local_700);
            auVar199 = ZEXT3264(auVar149);
            if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar152 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar152 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar152 >> 0x7f,0) == '\0') &&
                  (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar152 >> 0xbf,0) == '\0') &&
                (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar152[0x1f]) goto LAB_01645b93;
            auVar131 = vsubps_avx(ZEXT1632(auVar16),auVar102);
            auVar16 = vfmadd213ps_fma(auVar131,local_5e0,auVar102);
            fVar135 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
            auVar67._4_4_ = (auVar16._4_4_ + auVar16._4_4_) * fVar135;
            auVar67._0_4_ = (auVar16._0_4_ + auVar16._0_4_) * fVar135;
            auVar67._8_4_ = (auVar16._8_4_ + auVar16._8_4_) * fVar135;
            auVar67._12_4_ = (auVar16._12_4_ + auVar16._12_4_) * fVar135;
            auVar67._16_4_ = fVar135 * 0.0;
            auVar67._20_4_ = fVar135 * 0.0;
            auVar67._24_4_ = fVar135 * 0.0;
            auVar67._28_4_ = fVar135;
            auVar109 = auVar192._0_32_;
            auVar131 = vcmpps_avx(auVar109,auVar67,6);
            auVar203 = auVar152 & auVar131;
            auVar182 = ZEXT3264(CONCAT428(fStack_6c4,
                                          CONCAT424(fStack_6c8,
                                                    CONCAT420(fStack_6cc,
                                                              CONCAT416(fStack_6d0,
                                                                        CONCAT412(fStack_6d4,
                                                                                  CONCAT48(
                                                  fStack_6d8,CONCAT44(fStack_6dc,local_6e0))))))));
            auVar178 = ZEXT3264(CONCAT428(fVar217,CONCAT424(fVar212,CONCAT420(fVar217,CONCAT416(
                                                  fVar212,CONCAT412(fVar217,CONCAT48(fVar212,uVar95)
                                                                   ))))));
            auVar186 = ZEXT3264(local_6c0);
            if ((((((((auVar203 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar203 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar203 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar203 >> 0x7f,0) == '\0') &&
                  (auVar203 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar203 >> 0xbf,0) == '\0') &&
                (auVar203 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar203[0x1f]) {
              auVar133 = ZEXT3264(local_5e0);
            }
            else {
              auVar132._8_4_ = 0xbf800000;
              auVar132._0_8_ = 0xbf800000bf800000;
              auVar132._12_4_ = 0xbf800000;
              auVar132._16_4_ = 0xbf800000;
              auVar132._20_4_ = 0xbf800000;
              auVar132._24_4_ = 0xbf800000;
              auVar132._28_4_ = 0xbf800000;
              auVar147._8_4_ = 0x40000000;
              auVar147._0_8_ = 0x4000000040000000;
              auVar147._12_4_ = 0x40000000;
              auVar147._16_4_ = 0x40000000;
              auVar147._20_4_ = 0x40000000;
              auVar147._24_4_ = 0x40000000;
              auVar147._28_4_ = 0x40000000;
              auVar16 = vfmadd213ps_fma(local_380,auVar147,auVar132);
              local_260 = local_5e0;
              local_240 = ZEXT1632(auVar16);
              local_1f0 = local_650;
              uStack_1e8 = uStack_648;
              local_1e0 = local_660;
              uStack_1d8 = uStack_658;
              local_1d0 = local_670;
              uStack_1c8 = uStack_668;
              pGVar12 = (context->scene->geometries).items[local_708].ptr;
              auVar133 = ZEXT3264(local_5e0);
              local_380 = local_240;
              if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                bVar86 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar86 = 1, pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar131 = vandps_avx(auVar131,auVar152);
                fVar135 = (float)local_200;
                local_180[0] = (fVar135 + local_5e0._0_4_ + 0.0) * local_120;
                local_180[1] = (fVar135 + local_5e0._4_4_ + 1.0) * fStack_11c;
                local_180[2] = (fVar135 + local_5e0._8_4_ + 2.0) * fStack_118;
                local_180[3] = (fVar135 + local_5e0._12_4_ + 3.0) * fStack_114;
                fStack_170 = (fVar135 + local_5e0._16_4_ + 4.0) * fStack_110;
                fStack_16c = (fVar135 + local_5e0._20_4_ + 5.0) * fStack_10c;
                fStack_168 = (fVar135 + local_5e0._24_4_ + 6.0) * fStack_108;
                fStack_164 = fVar135 + local_5e0._28_4_ + 7.0;
                local_380._0_8_ = auVar16._0_8_;
                local_380._8_8_ = auVar16._8_8_;
                local_160 = local_380._0_8_;
                uStack_158 = local_380._8_8_;
                uStack_150 = 0;
                uStack_148 = 0;
                local_140 = auVar109;
                uVar88 = vmovmskps_avx(auVar131);
                if (uVar88 == 0) {
                  bVar86 = 0;
LAB_01646110:
                  auVar204 = ZEXT3264(local_700);
                  auVar133 = ZEXT3264(local_5e0);
                  auVar192 = ZEXT3264(auVar109);
                  auVar182 = ZEXT3264(CONCAT428(fStack_6c4,
                                                CONCAT424(fStack_6c8,
                                                          CONCAT420(fStack_6cc,
                                                                    CONCAT416(fStack_6d0,
                                                                              CONCAT412(fStack_6d4,
                                                                                        CONCAT48(
                                                  fStack_6d8,CONCAT44(fStack_6dc,local_6e0))))))));
                  auVar178 = ZEXT3264(CONCAT428(fVar217,CONCAT424(fVar212,CONCAT420(fVar217,
                                                  CONCAT416(fVar212,CONCAT412(fVar217,CONCAT48(
                                                  fVar212,uVar95)))))));
                  auVar186 = ZEXT3264(local_6c0);
                }
                else {
                  uVar89 = (ulong)(uVar88 & 0xff);
                  local_800 = ZEXT1632(CONCAT88(auVar14._8_8_,uVar89));
                  lVar24 = 0;
                  for (; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
                    lVar24 = lVar24 + 1;
                  }
                  local_840 = ZEXT1632(CONCAT88(auVar17._8_8_,lVar24));
                  local_520 = (undefined4)*(undefined8 *)*local_638;
                  uStack_51c = (undefined4)((ulong)*(undefined8 *)*local_638 >> 0x20);
                  uStack_518 = (undefined4)*(undefined8 *)(*local_638 + 8);
                  uStack_514 = (undefined4)((ulong)*(undefined8 *)(*local_638 + 8) >> 0x20);
                  local_600 = ZEXT1632(CONCAT124(auVar15._4_12_,*(undefined4 *)(ray + k * 4 + 0x80))
                                      );
                  _local_4e0 = *pauVar5;
                  local_220 = auVar109;
                  local_1fc = iVar11;
                  do {
                    local_3e0 = local_180[local_840._0_8_];
                    local_3d0 = *(undefined4 *)((long)&local_160 + local_840._0_8_ * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) =
                         *(undefined4 *)(local_140 + local_840._0_8_ * 4);
                    fVar111 = 1.0 - local_3e0;
                    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar111 * fVar111)),
                                              ZEXT416((uint)(local_3e0 * fVar111)),
                                              ZEXT416(0xc0000000));
                    auVar14 = vfmsub132ss_fma(ZEXT416((uint)(local_3e0 * fVar111)),
                                              ZEXT416((uint)(local_3e0 * local_3e0)),
                                              ZEXT416(0x40000000));
                    fVar135 = auVar14._0_4_ * 3.0;
                    fVar134 = local_3e0 * local_3e0 * 3.0;
                    auVar164._0_4_ = fVar134 * local_5b0;
                    auVar164._4_4_ = fVar134 * fStack_5ac;
                    auVar164._8_4_ = fVar134 * fStack_5a8;
                    auVar164._12_4_ = fVar134 * fStack_5a4;
                    auVar140._4_4_ = fVar135;
                    auVar140._0_4_ = fVar135;
                    auVar140._8_4_ = fVar135;
                    auVar140._12_4_ = fVar135;
                    auVar76._8_8_ = uStack_668;
                    auVar76._0_8_ = local_670;
                    auVar14 = vfmadd132ps_fma(auVar140,auVar164,auVar76);
                    fVar135 = auVar15._0_4_ * 3.0;
                    auVar158._4_4_ = fVar135;
                    auVar158._0_4_ = fVar135;
                    auVar158._8_4_ = fVar135;
                    auVar158._12_4_ = fVar135;
                    auVar78._8_8_ = uStack_658;
                    auVar78._0_8_ = local_660;
                    auVar14 = vfmadd132ps_fma(auVar158,auVar14,auVar78);
                    fVar135 = fVar111 * fVar111 * -3.0;
                    local_630.context = context->user;
                    auVar141._4_4_ = fVar135;
                    auVar141._0_4_ = fVar135;
                    auVar141._8_4_ = fVar135;
                    auVar141._12_4_ = fVar135;
                    auVar80._8_8_ = uStack_648;
                    auVar80._0_8_ = local_650;
                    auVar14 = vfmadd132ps_fma(auVar141,auVar14,auVar80);
                    local_410 = auVar14._0_4_;
                    local_400 = vshufps_avx(auVar14,auVar14,0x55);
                    local_3f0 = vshufps_avx(auVar14,auVar14,0xaa);
                    uStack_3b8 = CONCAT44(uStack_5b4,uStack_5b8);
                    local_3c0 = local_5c0;
                    local_3b0._4_4_ = uStack_2ac;
                    local_3b0._0_4_ = local_2b0;
                    local_3b0._8_4_ = uStack_2a8;
                    local_3b0._12_4_ = uStack_2a4;
                    vpcmpeqd_avx2(ZEXT1632(local_3b0),ZEXT1632(local_3b0));
                    uStack_39c = (local_630.context)->instID[0];
                    local_3a0 = uStack_39c;
                    uStack_398 = uStack_39c;
                    uStack_394 = uStack_39c;
                    uStack_390 = (local_630.context)->instPrimID[0];
                    uStack_38c = uStack_390;
                    uStack_388 = uStack_390;
                    uStack_384 = uStack_390;
                    local_720._4_4_ = uStack_51c;
                    local_720._0_4_ = local_520;
                    local_720._8_4_ = uStack_518;
                    local_720._12_4_ = uStack_514;
                    local_630.valid = (int *)local_720;
                    local_630.geometryUserPtr = pGVar12->userPtr;
                    local_630.hit = (RTCHitN *)&local_410;
                    local_630.N = 4;
                    local_630.ray = (RTCRayN *)ray;
                    uStack_40c = local_410;
                    uStack_408 = local_410;
                    uStack_404 = local_410;
                    fStack_3dc = local_3e0;
                    fStack_3d8 = local_3e0;
                    fStack_3d4 = local_3e0;
                    uStack_3cc = local_3d0;
                    uStack_3c8 = local_3d0;
                    uStack_3c4 = local_3d0;
                    if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar210 = ZEXT1664(auVar210._0_16_);
                      (*pGVar12->occlusionFilterN)(&local_630);
                    }
                    if (local_720 == (undefined1  [16])0x0) {
                      auVar14 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                      auVar14 = auVar14 ^ _DAT_01f7ae20;
                    }
                    else {
                      p_Var13 = context->args->filter;
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar210 = ZEXT1664(auVar210._0_16_);
                        (*p_Var13)(&local_630);
                      }
                      auVar15 = vpcmpeqd_avx(local_720,_DAT_01f7aa10);
                      auVar14 = auVar15 ^ _DAT_01f7ae20;
                      auVar142._8_4_ = 0xff800000;
                      auVar142._0_8_ = 0xff800000ff800000;
                      auVar142._12_4_ = 0xff800000;
                      auVar15 = vblendvps_avx(auVar142,*(undefined1 (*) [16])(local_630.ray + 0x80),
                                              auVar15);
                      *(undefined1 (*) [16])(local_630.ray + 0x80) = auVar15;
                    }
                    auVar122._8_8_ = 0x100000001;
                    auVar122._0_8_ = 0x100000001;
                    if ((auVar122 & auVar14) != (undefined1  [16])0x0) {
                      bVar86 = 1;
                      goto LAB_01646110;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_600._0_4_;
                    uVar90 = local_800._0_8_ ^ 1L << (local_840._0_8_ & 0x3f);
                    bVar86 = 0;
                    local_800._0_8_ = uVar90;
                    lVar24 = 0;
                    for (uVar89 = uVar90; (uVar89 & 1) == 0;
                        uVar89 = uVar89 >> 1 | 0x8000000000000000) {
                      lVar24 = lVar24 + 1;
                    }
                    local_840._0_8_ = lVar24;
                    auVar204 = ZEXT3264(local_700);
                    auVar133 = ZEXT3264(local_5e0);
                    auVar192 = ZEXT3264(auVar109);
                    auVar182 = ZEXT3264(CONCAT428(fStack_6c4,
                                                  CONCAT424(fStack_6c8,
                                                            CONCAT420(fStack_6cc,
                                                                      CONCAT416(fStack_6d0,
                                                                                CONCAT412(fStack_6d4
                                                                                          ,CONCAT48(
                                                  fStack_6d8,CONCAT44(fStack_6dc,local_6e0))))))));
                    auVar178 = ZEXT3264(CONCAT428(fVar217,CONCAT424(fVar212,CONCAT420(fVar217,
                                                  CONCAT416(fVar212,CONCAT412(fVar217,CONCAT48(
                                                  fVar212,uVar95)))))));
                    auVar186 = ZEXT3264(local_6c0);
                  } while (uVar90 != 0);
                }
              }
              auVar199 = ZEXT3264(auVar149);
              bVar87 = (bool)(bVar87 | bVar86);
            }
          }
          local_5e0 = auVar133._0_32_;
          lVar92 = lVar92 + 8;
          auVar153 = ZEXT3264(local_6a0);
        } while ((int)lVar92 < iVar11);
      }
      if (bVar87) {
        return bVar87;
      }
      uVar94 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar100._4_4_ = uVar94;
      auVar100._0_4_ = uVar94;
      auVar100._8_4_ = uVar94;
      auVar100._12_4_ = uVar94;
      auVar14 = vcmpps_avx(local_2a0,auVar100,2);
      uVar88 = vmovmskps_avx(auVar14);
      uVar88 = (uint)uVar93 & uVar88;
    } while (uVar88 != 0);
  }
  return bVar87;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }